

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx2::CurveNvIntersector1<4>::
     occluded_t<embree::avx2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  int iVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  bool bVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  bool bVar45;
  undefined1 auVar46 [32];
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  ulong uVar62;
  byte bVar63;
  uint uVar64;
  ulong uVar65;
  long lVar66;
  uint uVar67;
  undefined4 uVar68;
  ulong uVar69;
  byte unaff_R13B;
  float fVar70;
  undefined8 uVar71;
  vint4 bi_2;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 extraout_var [60];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  float fVar100;
  float fVar131;
  float fVar132;
  vint4 bi_1;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar137 [16];
  undefined1 auVar142 [16];
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  vint4 ai_2;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  vint4 ai;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar182 [16];
  undefined1 auVar186 [32];
  vint4 bi;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [28];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [64];
  undefined1 auVar203 [28];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar209 [32];
  undefined1 auVar208 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [64];
  float fVar219;
  vint4 ai_1;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar220;
  float fVar221;
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar233;
  undefined1 auVar228 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  float fVar226;
  float fVar231;
  float fVar232;
  undefined1 auVar227 [16];
  undefined1 auVar229 [16];
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar230 [64];
  float fVar238;
  float fVar246;
  float fVar247;
  undefined1 auVar239 [16];
  float fVar248;
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar240 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [64];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  float fVar255;
  float fVar256;
  undefined1 auVar254 [64];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [64];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  float fVar271;
  float fVar272;
  float fVar274;
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined4 uVar273;
  undefined4 uVar275;
  undefined1 auVar270 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  bool local_aed;
  int local_aec;
  RayQueryContext *local_ae8;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  undefined4 local_a8c;
  ulong local_a88;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [16];
  undefined1 local_a30 [8];
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  RTCFilterFunctionNArguments local_9f0;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined8 local_930;
  undefined4 local_928;
  float local_924;
  undefined4 local_920;
  undefined4 local_91c;
  undefined4 local_918;
  uint local_914;
  uint local_910;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  undefined1 auStack_830 [16];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  Primitive *local_798;
  Primitive *local_790;
  ulong local_788;
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined4 local_740;
  undefined4 uStack_73c;
  undefined4 uStack_738;
  undefined4 uStack_734;
  undefined4 uStack_730;
  undefined4 uStack_72c;
  undefined4 uStack_728;
  undefined4 uStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  undefined1 auStack_6b0 [8];
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [32];
  ulong local_5c0;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined4 uStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_410 [16];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 extraout_var_00 [60];
  
  PVar3 = prim[1];
  uVar62 = (ulong)(byte)PVar3;
  lVar66 = uVar62 * 0x19;
  fVar100 = *(float *)(prim + lVar66 + 0x12);
  auVar81 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar66 + 6));
  auVar187._0_4_ = fVar100 * (ray->dir).field_0.m128[0];
  auVar187._4_4_ = fVar100 * (ray->dir).field_0.m128[1];
  auVar187._8_4_ = fVar100 * (ray->dir).field_0.m128[2];
  auVar187._12_4_ = fVar100 * (ray->dir).field_0.m128[3];
  auVar72._0_4_ = fVar100 * auVar81._0_4_;
  auVar72._4_4_ = fVar100 * auVar81._4_4_;
  auVar72._8_4_ = fVar100 * auVar81._8_4_;
  auVar72._12_4_ = fVar100 * auVar81._12_4_;
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 4 + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar179 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 5 + 6)));
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar228 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 6 + 6)));
  auVar228 = vcvtdq2ps_avx(auVar228);
  auVar118 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xb + 6)));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar141 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar62 + 6)));
  auVar141 = vcvtdq2ps_avx(auVar141);
  uVar69 = (ulong)(uint)((int)(uVar62 * 9) * 2);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + uVar62 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  uVar69 = (ulong)(uint)((int)(uVar62 * 5) << 2);
  auVar137 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + 6)));
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar262._4_4_ = auVar187._0_4_;
  auVar262._0_4_ = auVar187._0_4_;
  auVar262._8_4_ = auVar187._0_4_;
  auVar262._12_4_ = auVar187._0_4_;
  auVar102 = vshufps_avx(auVar187,auVar187,0x55);
  auVar73 = vshufps_avx(auVar187,auVar187,0xaa);
  fVar100 = auVar73._0_4_;
  auVar239._0_4_ = fVar100 * auVar228._0_4_;
  fVar70 = auVar73._4_4_;
  auVar239._4_4_ = fVar70 * auVar228._4_4_;
  fVar131 = auVar73._8_4_;
  auVar239._8_4_ = fVar131 * auVar228._8_4_;
  fVar219 = auVar73._12_4_;
  auVar239._12_4_ = fVar219 * auVar228._12_4_;
  auVar227._0_4_ = auVar141._0_4_ * fVar100;
  auVar227._4_4_ = auVar141._4_4_ * fVar70;
  auVar227._8_4_ = auVar141._8_4_ * fVar131;
  auVar227._12_4_ = auVar141._12_4_ * fVar219;
  auVar212._0_4_ = auVar137._0_4_ * fVar100;
  auVar212._4_4_ = auVar137._4_4_ * fVar70;
  auVar212._8_4_ = auVar137._8_4_ * fVar131;
  auVar212._12_4_ = auVar137._12_4_ * fVar219;
  auVar73 = vfmadd231ps_fma(auVar239,auVar102,auVar179);
  auVar103 = vfmadd231ps_fma(auVar227,auVar102,auVar6);
  auVar102 = vfmadd231ps_fma(auVar212,auVar74,auVar102);
  auVar154 = vfmadd231ps_fma(auVar73,auVar262,auVar81);
  auVar103 = vfmadd231ps_fma(auVar103,auVar262,auVar118);
  auVar177 = vfmadd231ps_fma(auVar102,auVar75,auVar262);
  auVar263._4_4_ = auVar72._0_4_;
  auVar263._0_4_ = auVar72._0_4_;
  auVar263._8_4_ = auVar72._0_4_;
  auVar263._12_4_ = auVar72._0_4_;
  auVar102 = vshufps_avx(auVar72,auVar72,0x55);
  auVar73 = vshufps_avx(auVar72,auVar72,0xaa);
  fVar100 = auVar73._0_4_;
  auVar188._0_4_ = fVar100 * auVar228._0_4_;
  fVar70 = auVar73._4_4_;
  auVar188._4_4_ = fVar70 * auVar228._4_4_;
  fVar131 = auVar73._8_4_;
  auVar188._8_4_ = fVar131 * auVar228._8_4_;
  fVar219 = auVar73._12_4_;
  auVar188._12_4_ = fVar219 * auVar228._12_4_;
  auVar101._0_4_ = auVar141._0_4_ * fVar100;
  auVar101._4_4_ = auVar141._4_4_ * fVar70;
  auVar101._8_4_ = auVar141._8_4_ * fVar131;
  auVar101._12_4_ = auVar141._12_4_ * fVar219;
  auVar73._0_4_ = auVar137._0_4_ * fVar100;
  auVar73._4_4_ = auVar137._4_4_ * fVar70;
  auVar73._8_4_ = auVar137._8_4_ * fVar131;
  auVar73._12_4_ = auVar137._12_4_ * fVar219;
  auVar179 = vfmadd231ps_fma(auVar188,auVar102,auVar179);
  auVar228 = vfmadd231ps_fma(auVar101,auVar102,auVar6);
  auVar6 = vfmadd231ps_fma(auVar73,auVar102,auVar74);
  auVar141 = vfmadd231ps_fma(auVar179,auVar263,auVar81);
  auVar74 = vfmadd231ps_fma(auVar228,auVar263,auVar118);
  auVar137 = vfmadd231ps_fma(auVar6,auVar263,auVar75);
  local_a40._8_4_ = 0x7fffffff;
  local_a40._0_8_ = 0x7fffffff7fffffff;
  local_a40._12_4_ = 0x7fffffff;
  auVar81 = vandps_avx(auVar154,local_a40);
  auVar176._8_4_ = 0x219392ef;
  auVar176._0_8_ = 0x219392ef219392ef;
  auVar176._12_4_ = 0x219392ef;
  auVar81 = vcmpps_avx(auVar81,auVar176,1);
  auVar179 = vblendvps_avx(auVar154,auVar176,auVar81);
  auVar81 = vandps_avx(auVar103,local_a40);
  auVar81 = vcmpps_avx(auVar81,auVar176,1);
  auVar228 = vblendvps_avx(auVar103,auVar176,auVar81);
  auVar81 = vandps_avx(auVar177,local_a40);
  auVar81 = vcmpps_avx(auVar81,auVar176,1);
  auVar81 = vblendvps_avx(auVar177,auVar176,auVar81);
  auVar118 = vrcpps_avx(auVar179);
  auVar208._8_4_ = 0x3f800000;
  auVar208._0_8_ = &DAT_3f8000003f800000;
  auVar208._12_4_ = 0x3f800000;
  auVar179 = vfnmadd213ps_fma(auVar179,auVar118,auVar208);
  auVar118 = vfmadd132ps_fma(auVar179,auVar118,auVar118);
  auVar179 = vrcpps_avx(auVar228);
  auVar228 = vfnmadd213ps_fma(auVar228,auVar179,auVar208);
  auVar6 = vfmadd132ps_fma(auVar228,auVar179,auVar179);
  auVar179 = vrcpps_avx(auVar81);
  auVar228 = vfnmadd213ps_fma(auVar81,auVar179,auVar208);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar62 * 7 + 6);
  auVar81 = vpmovsxwd_avx(auVar81);
  auVar75 = vfmadd132ps_fma(auVar228,auVar179,auVar179);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar141);
  auVar177._0_4_ = auVar118._0_4_ * auVar81._0_4_;
  auVar177._4_4_ = auVar118._4_4_ * auVar81._4_4_;
  auVar177._8_4_ = auVar118._8_4_ * auVar81._8_4_;
  auVar177._12_4_ = auVar118._12_4_ * auVar81._12_4_;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *(ulong *)(prim + uVar62 * 9 + 6);
  auVar81 = vpmovsxwd_avx(auVar179);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar141);
  auVar189._0_4_ = auVar118._0_4_ * auVar81._0_4_;
  auVar189._4_4_ = auVar118._4_4_ * auVar81._4_4_;
  auVar189._8_4_ = auVar118._8_4_ * auVar81._8_4_;
  auVar189._12_4_ = auVar118._12_4_ * auVar81._12_4_;
  auVar103._1_3_ = 0;
  auVar103[0] = PVar3;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar179 = vpmovsxwd_avx(auVar228);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar62 * -2 + 6);
  auVar81 = vpmovsxwd_avx(auVar118);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar74);
  auVar213._0_4_ = auVar81._0_4_ * auVar6._0_4_;
  auVar213._4_4_ = auVar81._4_4_ * auVar6._4_4_;
  auVar213._8_4_ = auVar81._8_4_ * auVar6._8_4_;
  auVar213._12_4_ = auVar81._12_4_ * auVar6._12_4_;
  auVar81 = vcvtdq2ps_avx(auVar179);
  auVar81 = vsubps_avx(auVar81,auVar74);
  auVar102._0_4_ = auVar6._0_4_ * auVar81._0_4_;
  auVar102._4_4_ = auVar6._4_4_ * auVar81._4_4_;
  auVar102._8_4_ = auVar6._8_4_ * auVar81._8_4_;
  auVar102._12_4_ = auVar6._12_4_ * auVar81._12_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar69 + uVar62 + 6);
  auVar81 = vpmovsxwd_avx(auVar6);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar137);
  auVar154._0_4_ = auVar75._0_4_ * auVar81._0_4_;
  auVar154._4_4_ = auVar75._4_4_ * auVar81._4_4_;
  auVar154._8_4_ = auVar75._8_4_ * auVar81._8_4_;
  auVar154._12_4_ = auVar75._12_4_ * auVar81._12_4_;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + uVar62 * 0x17 + 6);
  auVar81 = vpmovsxwd_avx(auVar141);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar137);
  auVar74._0_4_ = auVar75._0_4_ * auVar81._0_4_;
  auVar74._4_4_ = auVar75._4_4_ * auVar81._4_4_;
  auVar74._8_4_ = auVar75._8_4_ * auVar81._8_4_;
  auVar74._12_4_ = auVar75._12_4_ * auVar81._12_4_;
  auVar81 = vpminsd_avx(auVar177,auVar189);
  auVar179 = vpminsd_avx(auVar213,auVar102);
  auVar81 = vmaxps_avx(auVar81,auVar179);
  auVar179 = vpminsd_avx(auVar154,auVar74);
  uVar68 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar222._4_4_ = uVar68;
  auVar222._0_4_ = uVar68;
  auVar222._8_4_ = uVar68;
  auVar222._12_4_ = uVar68;
  auVar179 = vmaxps_avx(auVar179,auVar222);
  auVar81 = vmaxps_avx(auVar81,auVar179);
  local_410._0_4_ = auVar81._0_4_ * 0.99999964;
  local_410._4_4_ = auVar81._4_4_ * 0.99999964;
  local_410._8_4_ = auVar81._8_4_ * 0.99999964;
  local_410._12_4_ = auVar81._12_4_ * 0.99999964;
  auVar81 = vpmaxsd_avx(auVar177,auVar189);
  auVar179 = vpmaxsd_avx(auVar213,auVar102);
  auVar81 = vminps_avx(auVar81,auVar179);
  auVar179 = vpmaxsd_avx(auVar154,auVar74);
  fVar100 = ray->tfar;
  auVar137._4_4_ = fVar100;
  auVar137._0_4_ = fVar100;
  auVar137._8_4_ = fVar100;
  auVar137._12_4_ = fVar100;
  auVar179 = vminps_avx(auVar179,auVar137);
  auVar81 = vminps_avx(auVar81,auVar179);
  auVar75._0_4_ = auVar81._0_4_ * 1.0000004;
  auVar75._4_4_ = auVar81._4_4_ * 1.0000004;
  auVar75._8_4_ = auVar81._8_4_ * 1.0000004;
  auVar75._12_4_ = auVar81._12_4_ * 1.0000004;
  auVar103[4] = PVar3;
  auVar103._5_3_ = 0;
  auVar103[8] = PVar3;
  auVar103._9_3_ = 0;
  auVar103[0xc] = PVar3;
  auVar103._13_3_ = 0;
  auVar179 = vpcmpgtd_avx(auVar103,_DAT_01ff0cf0);
  auVar81 = vcmpps_avx(local_410,auVar75,2);
  auVar81 = vandps_avx(auVar81,auVar179);
  uVar64 = vmovmskps_avx(auVar81);
  local_aed = uVar64 != 0;
  if (uVar64 == 0) {
    return local_aed;
  }
  uVar64 = uVar64 & 0xff;
  auVar94._16_16_ = mm_lookupmask_ps._240_16_;
  auVar94._0_16_ = mm_lookupmask_ps._240_16_;
  local_798 = prim + lVar66 + 0x16;
  local_2a0 = vblendps_avx(auVar94,ZEXT832(0) << 0x20,0x80);
  local_740 = 0x7fffffff;
  uStack_73c = 0x7fffffff;
  uStack_738 = 0x7fffffff;
  uStack_734 = 0x7fffffff;
  uStack_730 = 0x7fffffff;
  uStack_72c = 0x7fffffff;
  uStack_728 = 0x7fffffff;
  uStack_724 = 0x7fffffff;
  local_ae8 = context;
  local_790 = prim;
LAB_0163560e:
  lVar66 = 0;
  local_788 = (ulong)uVar64;
  for (uVar62 = local_788; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
    lVar66 = lVar66 + 1;
  }
  local_788 = local_788 - 1 & local_788;
  local_a8c = *(undefined4 *)(local_790 + lVar66 * 4 + 6);
  uVar62 = (ulong)(uint)((int)lVar66 << 6);
  auVar81 = *(undefined1 (*) [16])(local_798 + uVar62);
  if (local_788 != 0) {
    uVar65 = local_788 - 1 & local_788;
    for (uVar69 = local_788; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
    }
    if (uVar65 != 0) {
      for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
      }
    }
  }
  local_a88 = (ulong)*(uint *)(local_790 + 2);
  auVar179 = *(undefined1 (*) [16])(local_798 + uVar62 + 0x10);
  auVar228 = *(undefined1 (*) [16])(local_798 + uVar62 + 0x20);
  auVar118 = *(undefined1 (*) [16])(local_798 + uVar62 + 0x30);
  auVar190._0_4_ = (auVar81._0_4_ + auVar179._0_4_ + auVar228._0_4_ + auVar118._0_4_) * 0.25;
  auVar190._4_4_ = (auVar81._4_4_ + auVar179._4_4_ + auVar228._4_4_ + auVar118._4_4_) * 0.25;
  auVar190._8_4_ = (auVar81._8_4_ + auVar179._8_4_ + auVar228._8_4_ + auVar118._8_4_) * 0.25;
  auVar190._12_4_ = (auVar81._12_4_ + auVar179._12_4_ + auVar228._12_4_ + auVar118._12_4_) * 0.25;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar6 = vsubps_avx(auVar190,(undefined1  [16])aVar1);
  auVar6 = vdpps_avx(auVar6,(undefined1  [16])aVar2,0x7f);
  auVar141 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar75 = vrcpss_avx(auVar141,auVar141);
  auVar141 = vfnmadd213ss_fma(auVar75,auVar141,ZEXT416(0x40000000));
  fVar100 = auVar6._0_4_ * auVar75._0_4_ * auVar141._0_4_;
  local_7c0 = ZEXT416((uint)fVar100);
  auVar191._4_4_ = fVar100;
  auVar191._0_4_ = fVar100;
  auVar191._8_4_ = fVar100;
  auVar191._12_4_ = fVar100;
  fStack_850 = fVar100;
  _local_860 = auVar191;
  fStack_84c = fVar100;
  fStack_848 = fVar100;
  fStack_844 = fVar100;
  auVar6 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar191);
  auVar6 = vblendps_avx(auVar6,_DAT_01feba10,8);
  local_a00 = vsubps_avx(auVar81,auVar6);
  local_a10 = vsubps_avx(auVar228,auVar6);
  local_a20 = vsubps_avx(auVar179,auVar6);
  _local_a30 = vsubps_avx(auVar118,auVar6);
  auVar81 = vmovshdup_avx(local_a00);
  uVar71 = auVar81._0_8_;
  local_900._8_8_ = uVar71;
  local_900._0_8_ = uVar71;
  local_900._16_8_ = uVar71;
  local_900._24_8_ = uVar71;
  auVar202 = ZEXT3264(local_900);
  auVar81 = vshufps_avx(local_a00,local_a00,0xaa);
  uVar71 = auVar81._0_8_;
  local_480._8_8_ = uVar71;
  local_480._0_8_ = uVar71;
  local_480._16_8_ = uVar71;
  local_480._24_8_ = uVar71;
  auVar211 = ZEXT3264(local_480);
  auVar81 = vshufps_avx(local_a00,local_a00,0xff);
  local_1a0 = auVar81._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar81 = vmovshdup_avx(local_a20);
  uVar71 = auVar81._0_8_;
  auVar244._8_8_ = uVar71;
  auVar244._0_8_ = uVar71;
  auVar244._16_8_ = uVar71;
  auVar244._24_8_ = uVar71;
  auVar81 = vshufps_avx(local_a20,local_a20,0xaa);
  uVar71 = auVar81._0_8_;
  local_980._8_8_ = uVar71;
  local_980._0_8_ = uVar71;
  local_980._16_8_ = uVar71;
  local_980._24_8_ = uVar71;
  auVar254 = ZEXT3264(local_980);
  auVar81 = vshufps_avx(local_a20,local_a20,0xff);
  local_1c0 = auVar81._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar81 = vmovshdup_avx(local_a10);
  local_360 = auVar81._0_4_;
  fStack_35c = auVar81._4_4_;
  auVar81 = vshufps_avx(local_a10,local_a10,0xaa);
  uVar71 = auVar81._0_8_;
  local_2c0._8_8_ = uVar71;
  local_2c0._0_8_ = uVar71;
  local_2c0._16_8_ = uVar71;
  local_2c0._24_8_ = uVar71;
  auVar81 = vshufps_avx(local_a10,local_a10,0xff);
  local_1e0 = auVar81._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar81 = vmovshdup_avx(_local_a30);
  local_200 = auVar81._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar81 = vshufps_avx(_local_a30,_local_a30,0xaa);
  local_220 = auVar81._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar81 = vshufps_avx(_local_a30,_local_a30,0xff);
  local_240 = auVar81._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar76._0_4_ = aVar2.x * aVar2.x;
  auVar76._4_4_ = aVar2.y * aVar2.y;
  auVar76._8_4_ = aVar2.z * aVar2.z;
  auVar76._12_4_ = aVar2.field_3.w * aVar2.field_3.w;
  auVar81 = vshufps_avx(auVar76,auVar76,0xaa);
  uVar68 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_6e0._4_4_ = uVar68;
  local_6e0._0_4_ = uVar68;
  fStack_6d8 = (float)uVar68;
  fStack_6d4 = (float)uVar68;
  fStack_6d0 = (float)uVar68;
  fStack_6cc = (float)uVar68;
  fStack_6c8 = (float)uVar68;
  register0x0000125c = uVar68;
  uVar71 = auVar81._0_8_;
  auVar240._8_8_ = uVar71;
  auVar240._0_8_ = uVar71;
  auVar240._16_8_ = uVar71;
  auVar240._24_8_ = uVar71;
  auVar81 = vfmadd231ps_fma(auVar240,_local_6e0,_local_6e0);
  uVar68 = *(undefined4 *)&(ray->dir).field_0;
  local_700._4_4_ = uVar68;
  local_700._0_4_ = uVar68;
  fStack_6f8 = (float)uVar68;
  fStack_6f4 = (float)uVar68;
  fStack_6f0 = (float)uVar68;
  fStack_6ec = (float)uVar68;
  fStack_6e8 = (float)uVar68;
  register0x0000149c = uVar68;
  auVar230 = ZEXT3264(_local_700);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),_local_700,_local_700);
  auVar245 = ZEXT1664(auVar81);
  local_5c0 = 1;
  uVar62 = 0;
  bVar63 = 0;
  local_4a0 = (ray->dir).field_0.m128[2];
  local_2e0._0_4_ = local_a00._0_4_;
  local_2e0._4_4_ = local_2e0._0_4_;
  local_2e0._8_4_ = local_2e0._0_4_;
  local_2e0._12_4_ = local_2e0._0_4_;
  local_2e0._16_4_ = local_2e0._0_4_;
  local_2e0._20_4_ = local_2e0._0_4_;
  local_2e0._24_4_ = local_2e0._0_4_;
  local_2e0._28_4_ = local_2e0._0_4_;
  uVar68 = local_a20._0_4_;
  local_300._4_4_ = uVar68;
  local_300._0_4_ = uVar68;
  local_300._8_4_ = uVar68;
  local_300._12_4_ = uVar68;
  local_300._16_4_ = uVar68;
  local_300._20_4_ = uVar68;
  local_300._24_4_ = uVar68;
  local_300._28_4_ = uVar68;
  uVar68 = local_a10._0_4_;
  local_320._4_4_ = uVar68;
  local_320._0_4_ = uVar68;
  local_320._8_4_ = uVar68;
  local_320._12_4_ = uVar68;
  local_320._16_4_ = uVar68;
  local_320._20_4_ = uVar68;
  local_320._24_4_ = uVar68;
  local_320._28_4_ = uVar68;
  local_280 = local_a30._0_4_;
  fStack_27c = local_280;
  fStack_278 = local_280;
  fStack_274 = local_280;
  fStack_270 = local_280;
  fStack_26c = local_280;
  fStack_268 = local_280;
  fStack_264 = local_280;
  auVar8._4_4_ = uStack_73c;
  auVar8._0_4_ = local_740;
  auVar8._8_4_ = uStack_738;
  auVar8._12_4_ = uStack_734;
  auVar8._16_4_ = uStack_730;
  auVar8._20_4_ = uStack_72c;
  auVar8._24_4_ = uStack_728;
  auVar8._28_4_ = uStack_724;
  local_380 = vandps_avx(ZEXT1632(auVar81),auVar8);
  local_7b0 = ZEXT816(0x3f80000000000000);
  local_260 = ZEXT1632(auVar81);
  local_960 = auVar244;
  fStack_49c = local_4a0;
  fStack_498 = local_4a0;
  fStack_494 = local_4a0;
  fStack_490 = local_4a0;
  fStack_48c = local_4a0;
  fStack_488 = local_4a0;
  fStack_484 = local_4a0;
  fStack_358 = local_360;
  fStack_354 = fStack_35c;
  fStack_350 = local_360;
  fStack_34c = fStack_35c;
  fStack_348 = local_360;
  fStack_344 = fStack_35c;
  do {
    auVar169._8_4_ = 0x3f800000;
    auVar169._0_8_ = &DAT_3f8000003f800000;
    auVar169._12_4_ = 0x3f800000;
    auVar169._16_4_ = 0x3f800000;
    auVar169._20_4_ = 0x3f800000;
    auVar169._24_4_ = 0x3f800000;
    auVar169._28_4_ = 0x3f800000;
    auVar81 = vmovshdup_avx(local_7b0);
    local_8e0._0_4_ = local_7b0._0_4_;
    fVar132 = auVar81._0_4_ - local_8e0._0_4_;
    fVar136 = fVar132 * 0.04761905;
    local_8e0._4_4_ = local_8e0._0_4_;
    local_8e0._8_4_ = local_8e0._0_4_;
    local_8e0._12_4_ = local_8e0._0_4_;
    local_8e0._16_4_ = local_8e0._0_4_;
    local_8e0._20_4_ = local_8e0._0_4_;
    local_8e0._24_4_ = local_8e0._0_4_;
    local_8e0._28_4_ = local_8e0._0_4_;
    local_640._4_4_ = fVar132;
    local_640._0_4_ = fVar132;
    local_640._8_4_ = fVar132;
    local_640._12_4_ = fVar132;
    local_640._16_4_ = fVar132;
    local_640._20_4_ = fVar132;
    local_640._24_4_ = fVar132;
    local_640._28_4_ = fVar132;
    auVar81 = vfmadd231ps_fma(local_8e0,local_640,_DAT_02020f20);
    auVar94 = vsubps_avx(auVar169,ZEXT1632(auVar81));
    fVar100 = auVar81._0_4_;
    auVar261._0_4_ = local_300._0_4_ * fVar100;
    fVar70 = auVar81._4_4_;
    auVar261._4_4_ = local_300._4_4_ * fVar70;
    fVar131 = auVar81._8_4_;
    auVar261._8_4_ = local_300._8_4_ * fVar131;
    fVar219 = auVar81._12_4_;
    auVar261._12_4_ = local_300._12_4_ * fVar219;
    auVar261._16_4_ = local_300._16_4_ * 0.0;
    auVar261._20_4_ = local_300._20_4_ * 0.0;
    auVar261._28_36_ = auVar245._28_36_;
    auVar261._24_4_ = local_300._24_4_ * 0.0;
    auVar245._0_4_ = auVar244._0_4_ * fVar100;
    auVar245._4_4_ = auVar244._4_4_ * fVar70;
    auVar245._8_4_ = auVar244._8_4_ * fVar131;
    auVar245._12_4_ = auVar244._12_4_ * fVar219;
    auVar245._16_4_ = auVar244._16_4_ * 0.0;
    auVar245._20_4_ = auVar244._20_4_ * 0.0;
    auVar245._28_36_ = auVar230._28_36_;
    auVar245._24_4_ = auVar244._24_4_ * 0.0;
    auVar230._0_4_ = auVar254._0_4_ * fVar100;
    auVar230._4_4_ = auVar254._4_4_ * fVar70;
    auVar230._8_4_ = auVar254._8_4_ * fVar131;
    auVar230._12_4_ = auVar254._12_4_ * fVar219;
    auVar230._16_4_ = auVar254._16_4_ * 0.0;
    auVar230._20_4_ = auVar254._20_4_ * 0.0;
    auVar230._28_36_ = auVar211._28_36_;
    auVar230._24_4_ = auVar254._24_4_ * 0.0;
    auVar60._8_8_ = uStack_1b8;
    auVar60._0_8_ = local_1c0;
    auVar60._16_8_ = uStack_1b0;
    auVar60._24_8_ = uStack_1a8;
    auVar9._4_4_ = (float)((ulong)local_1c0 >> 0x20) * fVar70;
    auVar9._0_4_ = (float)local_1c0 * fVar100;
    auVar9._8_4_ = (float)uStack_1b8 * fVar131;
    auVar9._12_4_ = (float)((ulong)uStack_1b8 >> 0x20) * fVar219;
    auVar9._16_4_ = (float)uStack_1b0 * 0.0;
    auVar9._20_4_ = (float)((ulong)uStack_1b0 >> 0x20) * 0.0;
    auVar9._24_4_ = (float)uStack_1a8 * 0.0;
    auVar9._28_4_ = fVar132;
    auVar81 = vfmadd231ps_fma(auVar261._0_32_,auVar94,local_2e0);
    auVar179 = vfmadd231ps_fma(auVar245._0_32_,auVar94,auVar202._0_32_);
    auVar228 = vfmadd231ps_fma(auVar230._0_32_,auVar94,local_480);
    auVar61._8_8_ = uStack_198;
    auVar61._0_8_ = local_1a0;
    auVar61._16_8_ = uStack_190;
    auVar61._24_8_ = uStack_188;
    auVar118 = vfmadd231ps_fma(auVar9,auVar94,auVar61);
    auVar144._4_4_ = local_320._4_4_ * fVar70;
    auVar144._0_4_ = local_320._0_4_ * fVar100;
    auVar144._8_4_ = local_320._8_4_ * fVar131;
    auVar144._12_4_ = local_320._12_4_ * fVar219;
    auVar144._16_4_ = local_320._16_4_ * 0.0;
    auVar144._20_4_ = local_320._20_4_ * 0.0;
    auVar144._24_4_ = local_320._24_4_ * 0.0;
    auVar144._28_4_ = local_2e0._28_4_;
    auVar211._0_4_ = fVar100 * local_360;
    auVar211._4_4_ = fVar70 * fStack_35c;
    auVar211._8_4_ = fVar131 * fStack_358;
    auVar211._12_4_ = fVar219 * fStack_354;
    auVar211._16_4_ = fStack_350 * 0.0;
    auVar211._20_4_ = fStack_34c * 0.0;
    auVar211._28_36_ = auVar202._28_36_;
    auVar211._24_4_ = fStack_348 * 0.0;
    auVar85._4_4_ = local_2c0._4_4_ * fVar70;
    auVar85._0_4_ = local_2c0._0_4_ * fVar100;
    auVar85._8_4_ = local_2c0._8_4_ * fVar131;
    auVar85._12_4_ = local_2c0._12_4_ * fVar219;
    auVar85._16_4_ = local_2c0._16_4_ * 0.0;
    auVar85._20_4_ = local_2c0._20_4_ * 0.0;
    auVar85._24_4_ = local_2c0._24_4_ * 0.0;
    auVar85._28_4_ = local_480._28_4_;
    auVar59._8_8_ = uStack_1d8;
    auVar59._0_8_ = local_1e0;
    auVar59._16_8_ = uStack_1d0;
    auVar59._24_8_ = uStack_1c8;
    auVar46._4_4_ = (float)((ulong)local_1e0 >> 0x20) * fVar70;
    auVar46._0_4_ = (float)local_1e0 * fVar100;
    auVar46._8_4_ = (float)uStack_1d8 * fVar131;
    auVar46._12_4_ = (float)((ulong)uStack_1d8 >> 0x20) * fVar219;
    auVar46._16_4_ = (float)uStack_1d0 * 0.0;
    auVar46._20_4_ = (float)((ulong)uStack_1d0 >> 0x20) * 0.0;
    auVar46._24_4_ = (float)uStack_1c8 * 0.0;
    auVar46._28_4_ = 0x3f800000;
    auVar6 = vfmadd231ps_fma(auVar144,auVar94,local_300);
    auVar141 = vfmadd231ps_fma(auVar211._0_32_,auVar94,auVar244);
    auVar75 = vfmadd231ps_fma(auVar85,auVar94,auVar254._0_32_);
    auVar74 = vfmadd231ps_fma(auVar46,auVar94,auVar60);
    auVar173._4_4_ = fVar70 * fStack_27c;
    auVar173._0_4_ = fVar100 * local_280;
    auVar173._8_4_ = fVar131 * fStack_278;
    auVar173._12_4_ = fVar219 * fStack_274;
    auVar173._16_4_ = fStack_270 * 0.0;
    auVar173._20_4_ = fStack_26c * 0.0;
    auVar173._24_4_ = fStack_268 * 0.0;
    auVar173._28_4_ = auVar244._28_4_;
    auVar202._0_4_ = fVar100 * (float)local_200;
    auVar202._4_4_ = fVar70 * local_200._4_4_;
    auVar202._8_4_ = fVar131 * (float)uStack_1f8;
    auVar202._12_4_ = fVar219 * uStack_1f8._4_4_;
    auVar202._16_4_ = (float)uStack_1f0 * 0.0;
    auVar202._20_4_ = uStack_1f0._4_4_ * 0.0;
    auVar202._28_36_ = auVar254._28_36_;
    auVar202._24_4_ = (float)uStack_1e8 * 0.0;
    auVar87._28_4_ = (int)((ulong)uStack_1a8 >> 0x20);
    auVar87._0_28_ =
         ZEXT1628(CONCAT412(auVar6._12_4_ * fVar219,
                            CONCAT48(auVar6._8_4_ * fVar131,
                                     CONCAT44(auVar6._4_4_ * fVar70,auVar6._0_4_ * fVar100))));
    auVar81 = vfmadd231ps_fma(auVar87,auVar94,ZEXT1632(auVar81));
    auVar179 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar219 * auVar141._12_4_,
                                                  CONCAT48(fVar131 * auVar141._8_4_,
                                                           CONCAT44(fVar70 * auVar141._4_4_,
                                                                    fVar100 * auVar141._0_4_)))),
                               auVar94,ZEXT1632(auVar179));
    auVar228 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar219 * auVar75._12_4_,
                                                  CONCAT48(fVar131 * auVar75._8_4_,
                                                           CONCAT44(fVar70 * auVar75._4_4_,
                                                                    fVar100 * auVar75._0_4_)))),
                               auVar94,ZEXT1632(auVar228));
    auVar146._28_4_ = local_300._28_4_;
    auVar146._0_28_ =
         ZEXT1628(CONCAT412(fVar219 * auVar74._12_4_,
                            CONCAT48(fVar131 * auVar74._8_4_,
                                     CONCAT44(fVar70 * auVar74._4_4_,fVar100 * auVar74._0_4_))));
    auVar118 = vfmadd231ps_fma(auVar146,auVar94,ZEXT1632(auVar118));
    auVar209._0_4_ = fVar100 * (float)local_220;
    auVar209._4_4_ = fVar70 * local_220._4_4_;
    auVar209._8_4_ = fVar131 * (float)uStack_218;
    auVar209._12_4_ = fVar219 * uStack_218._4_4_;
    auVar209._16_4_ = (float)uStack_210 * 0.0;
    auVar209._20_4_ = uStack_210._4_4_ * 0.0;
    auVar209._24_4_ = (float)uStack_208 * 0.0;
    auVar209._28_4_ = 0;
    auVar137 = vfmadd231ps_fma(auVar173,auVar94,local_320);
    auVar6 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar137._12_4_ * fVar219,
                                                CONCAT48(auVar137._8_4_ * fVar131,
                                                         CONCAT44(auVar137._4_4_ * fVar70,
                                                                  auVar137._0_4_ * fVar100)))),
                             auVar94,ZEXT1632(auVar6));
    auVar214._0_4_ = fVar100 * (float)local_240;
    auVar214._4_4_ = fVar70 * local_240._4_4_;
    auVar214._8_4_ = fVar131 * (float)uStack_238;
    auVar214._12_4_ = fVar219 * uStack_238._4_4_;
    auVar214._16_4_ = (float)uStack_230 * 0.0;
    auVar214._20_4_ = uStack_230._4_4_ * 0.0;
    auVar214._24_4_ = (float)uStack_228 * 0.0;
    auVar214._28_4_ = 0;
    auVar58._4_4_ = fStack_35c;
    auVar58._0_4_ = local_360;
    auVar58._8_4_ = fStack_358;
    auVar58._12_4_ = fStack_354;
    auVar58._16_4_ = fStack_350;
    auVar58._20_4_ = fStack_34c;
    auVar58._24_4_ = fStack_348;
    auVar58._28_4_ = fStack_344;
    auVar137 = vfmadd231ps_fma(auVar202._0_32_,auVar94,auVar58);
    auVar102 = vfmadd231ps_fma(auVar209,auVar94,local_2c0);
    auVar73 = vfmadd231ps_fma(auVar214,auVar94,auVar59);
    auVar266._28_4_ = local_2c0._28_4_;
    auVar266._0_28_ =
         ZEXT1628(CONCAT412(auVar73._12_4_ * fVar219,
                            CONCAT48(auVar73._8_4_ * fVar131,
                                     CONCAT44(auVar73._4_4_ * fVar70,auVar73._0_4_ * fVar100))));
    auVar141 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar137._12_4_ * fVar219,
                                                  CONCAT48(auVar137._8_4_ * fVar131,
                                                           CONCAT44(auVar137._4_4_ * fVar70,
                                                                    auVar137._0_4_ * fVar100)))),
                               auVar94,ZEXT1632(auVar141));
    auVar75 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar219 * auVar102._12_4_,
                                                 CONCAT48(fVar131 * auVar102._8_4_,
                                                          CONCAT44(fVar70 * auVar102._4_4_,
                                                                   fVar100 * auVar102._0_4_)))),
                              auVar94,ZEXT1632(auVar75));
    auVar74 = vfmadd231ps_fma(auVar266,auVar94,ZEXT1632(auVar74));
    auVar10._28_4_ = local_320._28_4_;
    auVar10._0_28_ =
         ZEXT1628(CONCAT412(auVar141._12_4_ * fVar219,
                            CONCAT48(auVar141._8_4_ * fVar131,
                                     CONCAT44(auVar141._4_4_ * fVar70,auVar141._0_4_ * fVar100))));
    auVar12._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    auVar12._0_28_ =
         ZEXT1628(CONCAT412(fVar219 * auVar75._12_4_,
                            CONCAT48(fVar131 * auVar75._8_4_,
                                     CONCAT44(fVar70 * auVar75._4_4_,fVar100 * auVar75._0_4_))));
    auVar137 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar6._12_4_ * fVar219,
                                                  CONCAT48(auVar6._8_4_ * fVar131,
                                                           CONCAT44(auVar6._4_4_ * fVar70,
                                                                    auVar6._0_4_ * fVar100)))),
                               auVar94,ZEXT1632(auVar81));
    auVar102 = vfmadd231ps_fma(auVar10,auVar94,ZEXT1632(auVar179));
    auVar85 = ZEXT1632(auVar102);
    auVar102 = vfmadd231ps_fma(auVar12,auVar94,ZEXT1632(auVar228));
    auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar74._12_4_ * fVar219,
                                                 CONCAT48(auVar74._8_4_ * fVar131,
                                                          CONCAT44(auVar74._4_4_ * fVar70,
                                                                   auVar74._0_4_ * fVar100)))),
                              ZEXT1632(auVar118),auVar94);
    auVar244 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar81));
    auVar94 = vsubps_avx(ZEXT1632(auVar141),ZEXT1632(auVar179));
    auVar8 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar228));
    auVar240 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar118));
    auVar203._0_4_ = fVar136 * auVar244._0_4_ * 3.0;
    auVar203._4_4_ = fVar136 * auVar244._4_4_ * 3.0;
    auVar203._8_4_ = fVar136 * auVar244._8_4_ * 3.0;
    auVar203._12_4_ = fVar136 * auVar244._12_4_ * 3.0;
    auVar203._16_4_ = fVar136 * auVar244._16_4_ * 3.0;
    auVar203._20_4_ = fVar136 * auVar244._20_4_ * 3.0;
    auVar203._24_4_ = fVar136 * auVar244._24_4_ * 3.0;
    local_820._28_4_ = 0;
    local_820._0_28_ = auVar203;
    local_840._0_4_ = fVar136 * auVar94._0_4_ * 3.0;
    local_840._4_4_ = fVar136 * auVar94._4_4_ * 3.0;
    fStack_838 = fVar136 * auVar94._8_4_ * 3.0;
    fStack_834 = fVar136 * auVar94._12_4_ * 3.0;
    register0x000013d0 = fVar136 * auVar94._16_4_ * 3.0;
    register0x000013d4 = fVar136 * auVar94._20_4_ * 3.0;
    register0x000013d8 = fVar136 * auVar94._24_4_ * 3.0;
    register0x000013dc = 0;
    local_9a0._0_4_ = fVar136 * auVar8._0_4_ * 3.0;
    local_9a0._4_4_ = fVar136 * auVar8._4_4_ * 3.0;
    local_9a0._8_4_ = fVar136 * auVar8._8_4_ * 3.0;
    local_9a0._12_4_ = fVar136 * auVar8._12_4_ * 3.0;
    local_9a0._16_4_ = fVar136 * auVar8._16_4_ * 3.0;
    local_9a0._20_4_ = fVar136 * auVar8._20_4_ * 3.0;
    local_9a0._24_4_ = fVar136 * auVar8._24_4_ * 3.0;
    local_9a0._28_4_ = 0;
    fVar100 = fVar136 * auVar240._0_4_ * 3.0;
    fVar131 = fVar136 * auVar240._4_4_ * 3.0;
    auVar88._4_4_ = fVar131;
    auVar88._0_4_ = fVar100;
    fVar132 = fVar136 * auVar240._8_4_ * 3.0;
    auVar88._8_4_ = fVar132;
    fVar133 = fVar136 * auVar240._12_4_ * 3.0;
    auVar88._12_4_ = fVar133;
    fVar134 = fVar136 * auVar240._16_4_ * 3.0;
    auVar88._16_4_ = fVar134;
    fVar135 = fVar136 * auVar240._20_4_ * 3.0;
    auVar88._20_4_ = fVar135;
    fVar136 = fVar136 * auVar240._24_4_ * 3.0;
    auVar88._24_4_ = fVar136;
    auVar88._28_4_ = auVar244._28_4_;
    local_a80 = ZEXT1632(auVar137);
    auVar10 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar137));
    local_7e0 = vpermps_avx2(_DAT_0205d4a0,auVar85);
    local_800 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar102));
    auVar9 = vsubps_avx(auVar10,local_a80);
    auVar144 = vsubps_avx(local_800,ZEXT1632(auVar102));
    fVar150 = auVar144._0_4_;
    fVar151 = auVar144._4_4_;
    auVar215._4_4_ = fVar151 * auVar203._4_4_;
    auVar215._0_4_ = fVar150 * auVar203._0_4_;
    fVar152 = auVar144._8_4_;
    auVar215._8_4_ = fVar152 * auVar203._8_4_;
    fVar153 = auVar144._12_4_;
    auVar215._12_4_ = fVar153 * auVar203._12_4_;
    fVar234 = auVar144._16_4_;
    auVar215._16_4_ = fVar234 * auVar203._16_4_;
    fVar236 = auVar144._20_4_;
    auVar215._20_4_ = fVar236 * auVar203._20_4_;
    fVar237 = auVar144._24_4_;
    auVar215._24_4_ = fVar237 * auVar203._24_4_;
    auVar215._28_4_ = local_800._28_4_;
    auVar81 = vfmsub231ps_fma(auVar215,local_9a0,auVar9);
    auVar173 = vsubps_avx(local_7e0,auVar85);
    fVar238 = auVar9._0_4_;
    fVar246 = auVar9._4_4_;
    auVar267._4_4_ = fVar246 * (float)local_840._4_4_;
    auVar267._0_4_ = fVar238 * (float)local_840._0_4_;
    fVar247 = auVar9._8_4_;
    auVar267._8_4_ = fVar247 * fStack_838;
    fVar248 = auVar9._12_4_;
    auVar267._12_4_ = fVar248 * fStack_834;
    fVar249 = auVar9._16_4_;
    auVar267._16_4_ = fVar249 * register0x000013d0;
    fVar250 = auVar9._20_4_;
    auVar267._20_4_ = fVar250 * register0x000013d4;
    fVar251 = auVar9._24_4_;
    auVar267._24_4_ = fVar251 * register0x000013d8;
    auVar267._28_4_ = auVar10._28_4_;
    auVar179 = vfmsub231ps_fma(auVar267,local_820,auVar173);
    auVar81 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar179._12_4_ * auVar179._12_4_,
                                                 CONCAT48(auVar179._8_4_ * auVar179._8_4_,
                                                          CONCAT44(auVar179._4_4_ * auVar179._4_4_,
                                                                   auVar179._0_4_ * auVar179._0_4_))
                                                )),ZEXT1632(auVar81),ZEXT1632(auVar81));
    fVar226 = auVar173._0_4_;
    fVar231 = auVar173._4_4_;
    auVar269._4_4_ = fVar231 * local_9a0._4_4_;
    auVar269._0_4_ = fVar226 * local_9a0._0_4_;
    fVar232 = auVar173._8_4_;
    auVar269._8_4_ = fVar232 * local_9a0._8_4_;
    fVar233 = auVar173._12_4_;
    auVar269._12_4_ = fVar233 * local_9a0._12_4_;
    fVar235 = auVar173._16_4_;
    auVar269._16_4_ = fVar235 * local_9a0._16_4_;
    fVar255 = auVar173._20_4_;
    auVar269._20_4_ = fVar255 * local_9a0._20_4_;
    fVar256 = auVar173._24_4_;
    auVar269._24_4_ = fVar256 * local_9a0._24_4_;
    auVar269._28_4_ = local_7e0._28_4_;
    auVar228 = vfmsub231ps_fma(auVar269,_local_840,auVar144);
    auVar170._0_4_ = fVar150 * fVar150;
    auVar170._4_4_ = fVar151 * fVar151;
    auVar170._8_4_ = fVar152 * fVar152;
    auVar170._12_4_ = fVar153 * fVar153;
    auVar170._16_4_ = fVar234 * fVar234;
    auVar170._20_4_ = fVar236 * fVar236;
    auVar170._24_4_ = fVar237 * fVar237;
    auVar170._28_4_ = 0;
    auVar179 = vfmadd231ps_fma(auVar170,auVar173,auVar173);
    auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar9,auVar9);
    auVar94 = vrcpps_avx(ZEXT1632(auVar179));
    auVar228 = vfmadd231ps_fma(ZEXT1632(auVar81),ZEXT1632(auVar228),ZEXT1632(auVar228));
    auVar257._8_4_ = 0x3f800000;
    auVar257._0_8_ = &DAT_3f8000003f800000;
    auVar257._12_4_ = 0x3f800000;
    auVar257._16_4_ = 0x3f800000;
    auVar257._20_4_ = 0x3f800000;
    auVar257._24_4_ = 0x3f800000;
    auVar257._28_4_ = 0x3f800000;
    auVar81 = vfnmadd213ps_fma(auVar94,ZEXT1632(auVar179),auVar257);
    auVar81 = vfmadd132ps_fma(ZEXT1632(auVar81),auVar94,auVar94);
    local_620 = vpermps_avx2(_DAT_0205d4a0,local_820);
    local_a60 = vpermps_avx2(_DAT_0205d4a0,local_9a0);
    auVar205._4_4_ = fVar151 * local_620._4_4_;
    auVar205._0_4_ = fVar150 * local_620._0_4_;
    auVar205._8_4_ = fVar152 * local_620._8_4_;
    auVar205._12_4_ = fVar153 * local_620._12_4_;
    auVar205._16_4_ = fVar234 * local_620._16_4_;
    auVar205._20_4_ = fVar236 * local_620._20_4_;
    auVar205._24_4_ = fVar237 * local_620._24_4_;
    auVar205._28_4_ = auVar94._28_4_;
    auVar118 = vfmsub231ps_fma(auVar205,local_a60,auVar9);
    local_8c0 = vpermps_avx2(_DAT_0205d4a0,_local_840);
    auVar7._4_4_ = fVar246 * local_8c0._4_4_;
    auVar7._0_4_ = fVar238 * local_8c0._0_4_;
    auVar7._8_4_ = fVar247 * local_8c0._8_4_;
    auVar7._12_4_ = fVar248 * local_8c0._12_4_;
    auVar7._16_4_ = fVar249 * local_8c0._16_4_;
    auVar7._20_4_ = fVar250 * local_8c0._20_4_;
    auVar7._24_4_ = fVar251 * local_8c0._24_4_;
    auVar7._28_4_ = 0;
    auVar6 = vfmsub231ps_fma(auVar7,local_620,auVar173);
    auVar118 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar6._12_4_ * auVar6._12_4_,
                                                  CONCAT48(auVar6._8_4_ * auVar6._8_4_,
                                                           CONCAT44(auVar6._4_4_ * auVar6._4_4_,
                                                                    auVar6._0_4_ * auVar6._0_4_)))),
                               ZEXT1632(auVar118),ZEXT1632(auVar118));
    fVar70 = local_a60._0_4_;
    auVar197._0_4_ = fVar226 * fVar70;
    fVar219 = local_a60._4_4_;
    auVar197._4_4_ = fVar231 * fVar219;
    fVar220 = local_a60._8_4_;
    auVar197._8_4_ = fVar232 * fVar220;
    fVar221 = local_a60._12_4_;
    auVar197._12_4_ = fVar233 * fVar221;
    fVar271 = local_a60._16_4_;
    auVar197._16_4_ = fVar235 * fVar271;
    fVar272 = local_a60._20_4_;
    auVar197._20_4_ = fVar255 * fVar272;
    fVar274 = local_a60._24_4_;
    auVar197._24_4_ = fVar256 * fVar274;
    auVar197._28_4_ = 0;
    auVar6 = vfmsub231ps_fma(auVar197,local_8c0,auVar144);
    auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),ZEXT1632(auVar6),ZEXT1632(auVar6));
    auVar94 = vmaxps_avx(ZEXT1632(CONCAT412(auVar228._12_4_ * auVar81._12_4_,
                                            CONCAT48(auVar228._8_4_ * auVar81._8_4_,
                                                     CONCAT44(auVar228._4_4_ * auVar81._4_4_,
                                                              auVar228._0_4_ * auVar81._0_4_)))),
                         ZEXT1632(CONCAT412(auVar118._12_4_ * auVar81._12_4_,
                                            CONCAT48(auVar118._8_4_ * auVar81._8_4_,
                                                     CONCAT44(auVar118._4_4_ * auVar81._4_4_,
                                                              auVar118._0_4_ * auVar81._0_4_)))));
    local_8a0._0_4_ = auVar73._0_4_ + fVar100;
    local_8a0._4_4_ = auVar73._4_4_ + fVar131;
    local_8a0._8_4_ = auVar73._8_4_ + fVar132;
    local_8a0._12_4_ = auVar73._12_4_ + fVar133;
    local_8a0._16_4_ = fVar134 + 0.0;
    local_8a0._20_4_ = fVar135 + 0.0;
    local_8a0._24_4_ = fVar136 + 0.0;
    local_8a0._28_4_ = auVar244._28_4_ + 0.0;
    auVar215 = ZEXT1632(auVar73);
    auVar244 = vsubps_avx(auVar215,auVar88);
    local_880 = vpermps_avx2(_DAT_0205d4a0,auVar244);
    local_660 = vpermps_avx2(_DAT_0205d4a0,auVar215);
    auVar244 = vmaxps_avx(auVar215,local_8a0);
    auVar8 = vmaxps_avx(local_880,local_660);
    auVar240 = vrsqrtps_avx(ZEXT1632(auVar179));
    auVar244 = vmaxps_avx(auVar244,auVar8);
    fVar100 = auVar240._0_4_;
    fVar131 = auVar240._4_4_;
    fVar136 = auVar240._8_4_;
    fVar132 = auVar240._12_4_;
    fVar133 = auVar240._16_4_;
    fVar134 = auVar240._20_4_;
    fVar135 = auVar240._24_4_;
    auVar13._4_4_ = fVar131 * fVar131 * fVar131 * auVar179._4_4_ * -0.5;
    auVar13._0_4_ = fVar100 * fVar100 * fVar100 * auVar179._0_4_ * -0.5;
    auVar13._8_4_ = fVar136 * fVar136 * fVar136 * auVar179._8_4_ * -0.5;
    auVar13._12_4_ = fVar132 * fVar132 * fVar132 * auVar179._12_4_ * -0.5;
    auVar13._16_4_ = fVar133 * fVar133 * fVar133 * -0.0;
    auVar13._20_4_ = fVar134 * fVar134 * fVar134 * -0.0;
    auVar13._24_4_ = fVar135 * fVar135 * fVar135 * -0.0;
    auVar13._28_4_ = auVar8._28_4_;
    auVar86._8_4_ = 0x3fc00000;
    auVar86._0_8_ = 0x3fc000003fc00000;
    auVar86._12_4_ = 0x3fc00000;
    auVar86._16_4_ = 0x3fc00000;
    auVar86._20_4_ = 0x3fc00000;
    auVar86._24_4_ = 0x3fc00000;
    auVar86._28_4_ = 0x3fc00000;
    auVar81 = vfmadd231ps_fma(auVar13,auVar86,auVar240);
    fVar131 = auVar81._0_4_;
    fVar136 = auVar81._4_4_;
    auVar14._4_4_ = fVar231 * fVar136;
    auVar14._0_4_ = fVar226 * fVar131;
    fVar133 = auVar81._8_4_;
    auVar14._8_4_ = fVar232 * fVar133;
    fVar135 = auVar81._12_4_;
    auVar14._12_4_ = fVar233 * fVar135;
    auVar14._16_4_ = fVar235 * 0.0;
    auVar14._20_4_ = fVar255 * 0.0;
    auVar14._24_4_ = fVar256 * 0.0;
    auVar14._28_4_ = 0;
    auVar15._4_4_ = fStack_49c * fVar151 * fVar136;
    auVar15._0_4_ = local_4a0 * fVar150 * fVar131;
    auVar15._8_4_ = fStack_498 * fVar152 * fVar133;
    auVar15._12_4_ = fStack_494 * fVar153 * fVar135;
    auVar15._16_4_ = fStack_490 * fVar234 * 0.0;
    auVar15._20_4_ = fStack_48c * fVar236 * 0.0;
    auVar15._24_4_ = fStack_488 * fVar237 * 0.0;
    auVar15._28_4_ = local_620._28_4_;
    auVar81 = vfmadd231ps_fma(auVar15,auVar14,_local_6e0);
    auVar267 = ZEXT1632(auVar102);
    auVar87 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar8 = vsubps_avx(auVar87,auVar267);
    auVar230 = ZEXT3264(auVar8);
    fVar226 = auVar8._0_4_;
    auVar268._0_4_ = fVar226 * fVar150 * fVar131;
    fVar231 = auVar8._4_4_;
    auVar268._4_4_ = fVar231 * fVar151 * fVar136;
    fVar232 = auVar8._8_4_;
    auVar268._8_4_ = fVar232 * fVar152 * fVar133;
    fVar233 = auVar8._12_4_;
    auVar268._12_4_ = fVar233 * fVar153 * fVar135;
    fVar235 = auVar8._16_4_;
    auVar268._16_4_ = fVar235 * fVar234 * 0.0;
    fVar234 = auVar8._20_4_;
    auVar268._20_4_ = fVar234 * fVar236 * 0.0;
    fVar236 = auVar8._24_4_;
    auVar268._24_4_ = fVar236 * fVar237 * 0.0;
    auVar268._28_4_ = 0;
    auVar87 = vsubps_avx(auVar87,auVar85);
    auVar179 = vfmadd231ps_fma(auVar268,auVar87,auVar14);
    auVar16._4_4_ = fVar246 * fVar136;
    auVar16._0_4_ = fVar238 * fVar131;
    auVar16._8_4_ = fVar247 * fVar133;
    auVar16._12_4_ = fVar248 * fVar135;
    auVar16._16_4_ = fVar249 * 0.0;
    auVar16._20_4_ = fVar250 * 0.0;
    auVar16._24_4_ = fVar251 * 0.0;
    auVar16._28_4_ = auVar240._28_4_;
    auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar16,_local_700);
    auVar88 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar146 = vsubps_avx(auVar88,local_a80);
    auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar146,auVar16);
    auVar17._4_4_ = fVar231 * fStack_49c;
    auVar17._0_4_ = fVar226 * local_4a0;
    auVar17._8_4_ = fVar232 * fStack_498;
    auVar17._12_4_ = fVar233 * fStack_494;
    auVar17._16_4_ = fVar235 * fStack_490;
    auVar17._20_4_ = fVar234 * fStack_48c;
    auVar17._24_4_ = fVar236 * fStack_488;
    auVar17._28_4_ = auVar240._28_4_;
    auVar228 = vfmadd231ps_fma(auVar17,_local_6e0,auVar87);
    auVar228 = vfmadd231ps_fma(ZEXT1632(auVar228),_local_700,auVar146);
    fVar100 = auVar179._0_4_;
    fVar237 = auVar81._0_4_;
    fVar132 = auVar179._4_4_;
    fVar238 = auVar81._4_4_;
    fVar134 = auVar179._8_4_;
    fVar246 = auVar81._8_4_;
    fVar150 = auVar179._12_4_;
    fVar247 = auVar81._12_4_;
    auVar18._28_4_ = fStack_484;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(fVar247 * fVar150,
                            CONCAT48(fVar246 * fVar134,CONCAT44(fVar238 * fVar132,fVar237 * fVar100)
                                    )));
    auVar240 = vsubps_avx(ZEXT1632(auVar228),auVar18);
    auVar19._4_4_ = fVar231 * fVar231;
    auVar19._0_4_ = fVar226 * fVar226;
    auVar19._8_4_ = fVar232 * fVar232;
    auVar19._12_4_ = fVar233 * fVar233;
    auVar19._16_4_ = fVar235 * fVar235;
    auVar19._20_4_ = fVar234 * fVar234;
    auVar19._24_4_ = fVar236 * fVar236;
    auVar19._28_4_ = fStack_484;
    auVar228 = vfmadd231ps_fma(auVar19,auVar87,auVar87);
    auVar228 = vfmadd231ps_fma(ZEXT1632(auVar228),auVar146,auVar146);
    auVar20._28_4_ = auVar9._28_4_;
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(fVar150 * fVar150,
                            CONCAT48(fVar134 * fVar134,CONCAT44(fVar132 * fVar132,fVar100 * fVar100)
                                    )));
    local_680 = vsubps_avx(ZEXT1632(auVar228),auVar20);
    auVar8 = vsqrtps_avx(auVar94);
    fVar100 = (auVar8._0_4_ + auVar244._0_4_) * 1.0000002;
    fVar132 = (auVar8._4_4_ + auVar244._4_4_) * 1.0000002;
    fVar134 = (auVar8._8_4_ + auVar244._8_4_) * 1.0000002;
    fVar150 = (auVar8._12_4_ + auVar244._12_4_) * 1.0000002;
    fVar151 = (auVar8._16_4_ + auVar244._16_4_) * 1.0000002;
    fVar152 = (auVar8._20_4_ + auVar244._20_4_) * 1.0000002;
    fVar153 = (auVar8._24_4_ + auVar244._24_4_) * 1.0000002;
    auVar21._4_4_ = fVar132 * fVar132;
    auVar21._0_4_ = fVar100 * fVar100;
    auVar21._8_4_ = fVar134 * fVar134;
    auVar21._12_4_ = fVar150 * fVar150;
    auVar21._16_4_ = fVar151 * fVar151;
    auVar21._20_4_ = fVar152 * fVar152;
    auVar21._24_4_ = fVar153 * fVar153;
    auVar21._28_4_ = auVar8._28_4_ + auVar244._28_4_;
    fVar132 = auVar240._0_4_ + auVar240._0_4_;
    fVar134 = auVar240._4_4_ + auVar240._4_4_;
    auVar224._0_8_ = CONCAT44(fVar134,fVar132);
    auVar224._8_4_ = auVar240._8_4_ + auVar240._8_4_;
    auVar224._12_4_ = auVar240._12_4_ + auVar240._12_4_;
    auVar224._16_4_ = auVar240._16_4_ + auVar240._16_4_;
    auVar224._20_4_ = auVar240._20_4_ + auVar240._20_4_;
    auVar224._24_4_ = auVar240._24_4_ + auVar240._24_4_;
    fVar100 = auVar240._28_4_;
    auVar224._28_4_ = fVar100 + fVar100;
    auVar244 = vsubps_avx(local_680,auVar21);
    auVar12 = ZEXT1632(CONCAT412(fVar247 * fVar247,
                                 CONCAT48(fVar246 * fVar246,
                                          CONCAT44(fVar238 * fVar238,fVar237 * fVar237))));
    auVar240 = vsubps_avx(local_260,auVar12);
    local_6a0._4_4_ = fVar134 * fVar134;
    local_6a0._0_4_ = fVar132 * fVar132;
    local_6a0._8_4_ = auVar224._8_4_ * auVar224._8_4_;
    local_6a0._12_4_ = auVar224._12_4_ * auVar224._12_4_;
    local_6a0._16_4_ = auVar224._16_4_ * auVar224._16_4_;
    local_6a0._20_4_ = auVar224._20_4_ * auVar224._20_4_;
    local_6a0._24_4_ = auVar224._24_4_ * auVar224._24_4_;
    local_6a0._28_4_ = fVar100;
    fVar150 = auVar240._0_4_;
    fVar151 = auVar240._4_4_;
    fVar152 = auVar240._8_4_;
    fStack_5b8 = fVar152 * 4.0;
    fVar153 = auVar240._12_4_;
    fStack_5b4 = fVar153 * 4.0;
    fVar237 = auVar240._16_4_;
    fStack_5b0 = fVar237 * 4.0;
    fVar238 = auVar240._20_4_;
    fStack_5ac = fVar238 * 4.0;
    fVar246 = auVar240._24_4_;
    fStack_5a8 = fVar246 * 4.0;
    uStack_5a4 = 0x40800000;
    auVar22._4_4_ = fVar151 * 4.0 * auVar244._4_4_;
    auVar22._0_4_ = fVar150 * 4.0 * auVar244._0_4_;
    auVar22._8_4_ = fStack_5b8 * auVar244._8_4_;
    auVar22._12_4_ = fStack_5b4 * auVar244._12_4_;
    auVar22._16_4_ = fStack_5b0 * auVar244._16_4_;
    auVar22._20_4_ = fStack_5ac * auVar244._20_4_;
    auVar22._24_4_ = fStack_5a8 * auVar244._24_4_;
    auVar22._28_4_ = 0x40800000;
    auVar266 = vsubps_avx(local_6a0,auVar22);
    auVar94 = vcmpps_avx(auVar266,auVar88,5);
    auVar269 = ZEXT1632(auVar179);
    fVar100 = auVar240._28_4_;
    if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar94 >> 0x7f,0) == '\0') &&
          (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar94 >> 0xbf,0) == '\0') &&
        (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar94[0x1f]) {
      auVar241._8_4_ = 0x7f800000;
      auVar241._0_8_ = 0x7f8000007f800000;
      auVar241._12_4_ = 0x7f800000;
      auVar241._16_4_ = 0x7f800000;
      auVar241._20_4_ = 0x7f800000;
      auVar241._24_4_ = 0x7f800000;
      auVar241._28_4_ = 0x7f800000;
      auVar216._8_4_ = 0xff800000;
      auVar216._0_8_ = 0xff800000ff800000;
      auVar216._12_4_ = 0xff800000;
      auVar216._16_4_ = 0xff800000;
      auVar216._20_4_ = 0xff800000;
      auVar216._24_4_ = 0xff800000;
      auVar216._28_4_ = 0xff800000;
    }
    else {
      auVar7 = vsqrtps_avx(auVar266);
      auVar242._0_4_ = fVar150 + fVar150;
      auVar242._4_4_ = fVar151 + fVar151;
      auVar242._8_4_ = fVar152 + fVar152;
      auVar242._12_4_ = fVar153 + fVar153;
      auVar242._16_4_ = fVar237 + fVar237;
      auVar242._20_4_ = fVar238 + fVar238;
      auVar242._24_4_ = fVar246 + fVar246;
      auVar242._28_4_ = fVar100 + fVar100;
      auVar205 = vrcpps_avx(auVar242);
      auVar88 = vcmpps_avx(auVar266,auVar88,5);
      auVar89._8_4_ = 0x3f800000;
      auVar89._0_8_ = &DAT_3f8000003f800000;
      auVar89._12_4_ = 0x3f800000;
      auVar89._16_4_ = 0x3f800000;
      auVar89._20_4_ = 0x3f800000;
      auVar89._24_4_ = 0x3f800000;
      auVar89._28_4_ = 0x3f800000;
      auVar179 = vfnmadd213ps_fma(auVar242,auVar205,auVar89);
      auVar179 = vfmadd132ps_fma(ZEXT1632(auVar179),auVar205,auVar205);
      auVar90._0_8_ = CONCAT44(fVar134,fVar132) ^ 0x8000000080000000;
      auVar90._8_4_ = -auVar224._8_4_;
      auVar90._12_4_ = -auVar224._12_4_;
      auVar90._16_4_ = -auVar224._16_4_;
      auVar90._20_4_ = -auVar224._20_4_;
      auVar90._24_4_ = -auVar224._24_4_;
      auVar90._28_4_ = -auVar224._28_4_;
      auVar266 = vsubps_avx(auVar90,auVar7);
      auVar23._4_4_ = auVar179._4_4_ * auVar266._4_4_;
      auVar23._0_4_ = auVar179._0_4_ * auVar266._0_4_;
      auVar23._8_4_ = auVar179._8_4_ * auVar266._8_4_;
      auVar23._12_4_ = auVar179._12_4_ * auVar266._12_4_;
      auVar23._16_4_ = auVar266._16_4_ * 0.0;
      auVar23._20_4_ = auVar266._20_4_ * 0.0;
      auVar23._24_4_ = auVar266._24_4_ * 0.0;
      auVar23._28_4_ = auVar266._28_4_;
      auVar266 = vsubps_avx(auVar7,auVar224);
      auVar24._4_4_ = auVar179._4_4_ * auVar266._4_4_;
      auVar24._0_4_ = auVar179._0_4_ * auVar266._0_4_;
      auVar24._8_4_ = auVar179._8_4_ * auVar266._8_4_;
      auVar24._12_4_ = auVar179._12_4_ * auVar266._12_4_;
      auVar24._16_4_ = auVar266._16_4_ * 0.0;
      auVar24._20_4_ = auVar266._20_4_ * 0.0;
      auVar24._24_4_ = auVar266._24_4_ * 0.0;
      auVar24._28_4_ = auVar205._28_4_;
      auVar179 = vfmadd213ps_fma(ZEXT1632(auVar81),auVar23,auVar269);
      local_440 = ZEXT1632(CONCAT412(fVar135 * auVar179._12_4_,
                                     CONCAT48(fVar133 * auVar179._8_4_,
                                              CONCAT44(fVar136 * auVar179._4_4_,
                                                       fVar131 * auVar179._0_4_))));
      auVar179 = vfmadd213ps_fma(ZEXT1632(auVar81),auVar24,auVar269);
      local_460 = ZEXT1632(CONCAT412(auVar179._12_4_ * fVar135,
                                     CONCAT48(auVar179._8_4_ * fVar133,
                                              CONCAT44(auVar179._4_4_ * fVar136,
                                                       auVar179._0_4_ * fVar131))));
      auVar204._8_4_ = 0x7f800000;
      auVar204._0_8_ = 0x7f8000007f800000;
      auVar204._12_4_ = 0x7f800000;
      auVar204._16_4_ = 0x7f800000;
      auVar204._20_4_ = 0x7f800000;
      auVar204._24_4_ = 0x7f800000;
      auVar204._28_4_ = 0x7f800000;
      auVar241 = vblendvps_avx(auVar204,auVar23,auVar88);
      auVar53._4_4_ = uStack_73c;
      auVar53._0_4_ = local_740;
      auVar53._8_4_ = uStack_738;
      auVar53._12_4_ = uStack_734;
      auVar53._16_4_ = uStack_730;
      auVar53._20_4_ = uStack_72c;
      auVar53._24_4_ = uStack_728;
      auVar53._28_4_ = uStack_724;
      auVar266 = vandps_avx(auVar12,auVar53);
      auVar266 = vmaxps_avx(local_380,auVar266);
      auVar25._4_4_ = auVar266._4_4_ * 1.9073486e-06;
      auVar25._0_4_ = auVar266._0_4_ * 1.9073486e-06;
      auVar25._8_4_ = auVar266._8_4_ * 1.9073486e-06;
      auVar25._12_4_ = auVar266._12_4_ * 1.9073486e-06;
      auVar25._16_4_ = auVar266._16_4_ * 1.9073486e-06;
      auVar25._20_4_ = auVar266._20_4_ * 1.9073486e-06;
      auVar25._24_4_ = auVar266._24_4_ * 1.9073486e-06;
      auVar25._28_4_ = auVar266._28_4_;
      auVar266 = vandps_avx(auVar240,auVar53);
      auVar266 = vcmpps_avx(auVar266,auVar25,1);
      auVar91._8_4_ = 0xff800000;
      auVar91._0_8_ = 0xff800000ff800000;
      auVar91._12_4_ = 0xff800000;
      auVar91._16_4_ = 0xff800000;
      auVar91._20_4_ = 0xff800000;
      auVar91._24_4_ = 0xff800000;
      auVar91._28_4_ = 0xff800000;
      auVar216 = vblendvps_avx(auVar91,auVar24,auVar88);
      auVar205 = auVar88 & auVar266;
      if ((((((((auVar205 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar205 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar205 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar205 >> 0x7f,0) != '\0') ||
            (auVar205 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar205 >> 0xbf,0) != '\0') ||
          (auVar205 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar205[0x1f] < '\0') {
        auVar94 = vandps_avx(auVar266,auVar88);
        auVar266 = vcmpps_avx(auVar244,ZEXT832(0) << 0x20,2);
        auVar252._8_4_ = 0xff800000;
        auVar252._0_8_ = 0xff800000ff800000;
        auVar252._12_4_ = 0xff800000;
        auVar252._16_4_ = 0xff800000;
        auVar252._20_4_ = 0xff800000;
        auVar252._24_4_ = 0xff800000;
        auVar252._28_4_ = 0xff800000;
        auVar270._8_4_ = 0x7f800000;
        auVar270._0_8_ = 0x7f8000007f800000;
        auVar270._12_4_ = 0x7f800000;
        auVar270._16_4_ = 0x7f800000;
        auVar270._20_4_ = 0x7f800000;
        auVar270._24_4_ = 0x7f800000;
        auVar270._28_4_ = 0x7f800000;
        auVar244 = vblendvps_avx(auVar270,auVar252,auVar266);
        auVar179 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
        auVar205 = vpmovsxwd_avx2(auVar179);
        auVar241 = vblendvps_avx(auVar241,auVar244,auVar205);
        auVar244 = vblendvps_avx(auVar252,auVar270,auVar266);
        auVar216 = vblendvps_avx(auVar216,auVar244,auVar205);
        auVar97._0_8_ = auVar94._0_8_ ^ 0xffffffffffffffff;
        auVar97._8_4_ = auVar94._8_4_ ^ 0xffffffff;
        auVar97._12_4_ = auVar94._12_4_ ^ 0xffffffff;
        auVar97._16_4_ = auVar94._16_4_ ^ 0xffffffff;
        auVar97._20_4_ = auVar94._20_4_ ^ 0xffffffff;
        auVar97._24_4_ = auVar94._24_4_ ^ 0xffffffff;
        auVar97._28_4_ = auVar94._28_4_ ^ 0xffffffff;
        auVar94 = vorps_avx(auVar266,auVar97);
        auVar94 = vandps_avx(auVar88,auVar94);
      }
    }
    auVar244 = local_2a0 & auVar94;
    auVar210 = _local_6e0;
    if ((((((((auVar244 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar244 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar244 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar244 >> 0x7f,0) == '\0') &&
          (auVar244 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar244 >> 0xbf,0) == '\0') &&
        (auVar244 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar244[0x1f])
    {
LAB_01636073:
      auVar211 = ZEXT3264(auVar210);
      auVar202 = ZEXT3264(local_900);
      auVar245 = ZEXT3264(local_960);
      auVar254 = ZEXT3264(local_980);
    }
    else {
      fVar132 = (ray->org).field_0.m128[3] - (float)local_7c0._0_4_;
      auVar92._4_4_ = fVar132;
      auVar92._0_4_ = fVar132;
      auVar92._8_4_ = fVar132;
      auVar92._12_4_ = fVar132;
      auVar92._16_4_ = fVar132;
      auVar92._20_4_ = fVar132;
      auVar92._24_4_ = fVar132;
      auVar92._28_4_ = fVar132;
      auVar266 = vmaxps_avx(auVar92,auVar241);
      fVar132 = ray->tfar - (float)local_7c0._0_4_;
      auVar198._4_4_ = fVar132;
      auVar198._0_4_ = fVar132;
      auVar198._8_4_ = fVar132;
      auVar198._12_4_ = fVar132;
      auVar198._16_4_ = fVar132;
      auVar198._20_4_ = fVar132;
      auVar198._24_4_ = fVar132;
      auVar198._28_4_ = fVar132;
      auVar183._0_4_ = fVar226 * local_9a0._0_4_;
      auVar183._4_4_ = fVar231 * local_9a0._4_4_;
      auVar183._8_4_ = fVar232 * local_9a0._8_4_;
      auVar183._12_4_ = fVar233 * local_9a0._12_4_;
      auVar183._16_4_ = fVar235 * local_9a0._16_4_;
      auVar183._20_4_ = fVar234 * local_9a0._20_4_;
      auVar183._24_4_ = fVar236 * local_9a0._24_4_;
      auVar183._28_4_ = 0;
      auVar179 = vfmadd213ps_fma(auVar87,_local_840,auVar183);
      auVar228 = vfmadd213ps_fma(auVar146,local_820,ZEXT1632(auVar179));
      auVar26._4_4_ = fStack_49c * local_9a0._4_4_;
      auVar26._0_4_ = local_4a0 * local_9a0._0_4_;
      auVar26._8_4_ = fStack_498 * local_9a0._8_4_;
      auVar26._12_4_ = fStack_494 * local_9a0._12_4_;
      auVar26._16_4_ = fStack_490 * local_9a0._16_4_;
      auVar26._20_4_ = fStack_48c * local_9a0._20_4_;
      auVar26._24_4_ = fStack_488 * local_9a0._24_4_;
      auVar26._28_4_ = 0;
      auVar179 = vfmadd231ps_fma(auVar26,_local_6e0,_local_840);
      auVar118 = vfmadd231ps_fma(ZEXT1632(auVar179),_local_700,local_820);
      auVar54._4_4_ = uStack_73c;
      auVar54._0_4_ = local_740;
      auVar54._8_4_ = uStack_738;
      auVar54._12_4_ = uStack_734;
      auVar54._16_4_ = uStack_730;
      auVar54._20_4_ = uStack_72c;
      auVar54._24_4_ = uStack_728;
      auVar54._28_4_ = uStack_724;
      auVar244 = vandps_avx(auVar54,ZEXT1632(auVar118));
      auVar184._8_4_ = 0x219392ef;
      auVar184._0_8_ = 0x219392ef219392ef;
      auVar184._12_4_ = 0x219392ef;
      auVar184._16_4_ = 0x219392ef;
      auVar184._20_4_ = 0x219392ef;
      auVar184._24_4_ = 0x219392ef;
      auVar184._28_4_ = 0x219392ef;
      auVar87 = vcmpps_avx(auVar244,auVar184,1);
      auVar244 = vrcpps_avx(ZEXT1632(auVar118));
      auVar258._8_4_ = 0x3f800000;
      auVar258._0_8_ = &DAT_3f8000003f800000;
      auVar258._12_4_ = 0x3f800000;
      auVar258._16_4_ = 0x3f800000;
      auVar258._20_4_ = 0x3f800000;
      auVar258._24_4_ = 0x3f800000;
      auVar258._28_4_ = 0x3f800000;
      auVar205 = ZEXT1632(auVar118);
      auVar179 = vfnmadd213ps_fma(auVar244,auVar205,auVar258);
      auVar179 = vfmadd132ps_fma(ZEXT1632(auVar179),auVar244,auVar244);
      auVar171._0_8_ = auVar118._0_8_ ^ 0x8000000080000000;
      auVar171._8_4_ = auVar118._8_4_ ^ 0x80000000;
      auVar171._12_4_ = auVar118._12_4_ ^ 0x80000000;
      auVar171._16_4_ = 0x80000000;
      auVar171._20_4_ = 0x80000000;
      auVar171._24_4_ = 0x80000000;
      auVar171._28_4_ = 0x80000000;
      auVar243._0_4_ = auVar179._0_4_ * -auVar228._0_4_;
      auVar243._4_4_ = auVar179._4_4_ * -auVar228._4_4_;
      auVar243._8_4_ = auVar179._8_4_ * -auVar228._8_4_;
      auVar243._12_4_ = auVar179._12_4_ * -auVar228._12_4_;
      auVar243._16_4_ = 0x80000000;
      auVar243._20_4_ = 0x80000000;
      auVar243._24_4_ = 0x80000000;
      auVar243._28_4_ = 0;
      auVar244 = vcmpps_avx(auVar205,auVar171,1);
      auVar244 = vorps_avx(auVar87,auVar244);
      auVar264._8_4_ = 0xff800000;
      auVar264._0_8_ = 0xff800000ff800000;
      auVar264._12_4_ = 0xff800000;
      auVar264._16_4_ = 0xff800000;
      auVar264._20_4_ = 0xff800000;
      auVar264._24_4_ = 0xff800000;
      auVar264._28_4_ = 0xff800000;
      auVar244 = vblendvps_avx(auVar243,auVar264,auVar244);
      auVar88 = vminps_avx(auVar198,auVar216);
      auVar146 = vmaxps_avx(auVar266,auVar244);
      auVar244 = vcmpps_avx(auVar205,auVar171,6);
      auVar244 = vorps_avx(auVar87,auVar244);
      auVar265._8_4_ = 0x7f800000;
      auVar265._0_8_ = 0x7f8000007f800000;
      auVar265._12_4_ = 0x7f800000;
      auVar265._16_4_ = 0x7f800000;
      auVar265._20_4_ = 0x7f800000;
      auVar265._24_4_ = 0x7f800000;
      auVar265._28_4_ = 0x7f800000;
      auVar244 = vblendvps_avx(auVar243,auVar265,auVar244);
      auVar266 = vminps_avx(auVar88,auVar244);
      auVar230 = ZEXT864(0) << 0x20;
      auVar244 = vsubps_avx(ZEXT832(0) << 0x20,local_7e0);
      auVar87 = vsubps_avx(ZEXT832(0) << 0x20,local_800);
      auVar27._4_4_ = auVar87._4_4_ * fVar219;
      auVar27._0_4_ = auVar87._0_4_ * fVar70;
      auVar27._8_4_ = auVar87._8_4_ * fVar220;
      auVar27._12_4_ = auVar87._12_4_ * fVar221;
      auVar27._16_4_ = auVar87._16_4_ * fVar271;
      auVar27._20_4_ = auVar87._20_4_ * fVar272;
      auVar27._24_4_ = auVar87._24_4_ * fVar274;
      auVar27._28_4_ = auVar87._28_4_;
      auVar179 = vfnmsub231ps_fma(auVar27,local_8c0,auVar244);
      auVar244 = vsubps_avx(ZEXT832(0) << 0x20,auVar10);
      auVar228 = vfnmadd231ps_fma(ZEXT1632(auVar179),local_620,auVar244);
      auVar28._4_4_ = fStack_49c * fVar219;
      auVar28._0_4_ = local_4a0 * fVar70;
      auVar28._8_4_ = fStack_498 * fVar220;
      auVar28._12_4_ = fStack_494 * fVar221;
      auVar28._16_4_ = fStack_490 * fVar271;
      auVar28._20_4_ = fStack_48c * fVar272;
      auVar28._24_4_ = fStack_488 * fVar274;
      auVar28._28_4_ = auVar244._28_4_;
      auVar179 = vfnmsub231ps_fma(auVar28,local_8c0,_local_6e0);
      auVar118 = vfnmadd231ps_fma(ZEXT1632(auVar179),local_620,_local_700);
      auVar244 = vandps_avx(auVar54,ZEXT1632(auVar118));
      auVar10 = vrcpps_avx(ZEXT1632(auVar118));
      auVar217._8_4_ = 0x219392ef;
      auVar217._0_8_ = 0x219392ef219392ef;
      auVar217._12_4_ = 0x219392ef;
      auVar217._16_4_ = 0x219392ef;
      auVar217._20_4_ = 0x219392ef;
      auVar217._24_4_ = 0x219392ef;
      auVar217._28_4_ = 0x219392ef;
      auVar87 = vcmpps_avx(auVar244,auVar217,1);
      auVar88 = ZEXT1632(auVar118);
      auVar179 = vfnmadd213ps_fma(auVar10,auVar88,auVar258);
      auVar179 = vfmadd132ps_fma(ZEXT1632(auVar179),auVar10,auVar10);
      auVar210._0_8_ = auVar118._0_8_ ^ 0x8000000080000000;
      auVar210._8_4_ = auVar118._8_4_ ^ 0x80000000;
      auVar210._12_4_ = auVar118._12_4_ ^ 0x80000000;
      auVar210._16_4_ = 0x80000000;
      auVar210._20_4_ = 0x80000000;
      auVar210._24_4_ = 0x80000000;
      auVar210._28_4_ = 0x80000000;
      auVar29._4_4_ = auVar179._4_4_ * -auVar228._4_4_;
      auVar29._0_4_ = auVar179._0_4_ * -auVar228._0_4_;
      auVar29._8_4_ = auVar179._8_4_ * -auVar228._8_4_;
      auVar29._12_4_ = auVar179._12_4_ * -auVar228._12_4_;
      auVar29._16_4_ = 0x80000000;
      auVar29._20_4_ = 0x80000000;
      auVar29._24_4_ = 0x80000000;
      auVar29._28_4_ = 0x80000000;
      auVar244 = vcmpps_avx(auVar88,auVar210,1);
      auVar244 = vorps_avx(auVar244,auVar87);
      auVar225._8_4_ = 0xff800000;
      auVar225._0_8_ = 0xff800000ff800000;
      auVar225._12_4_ = 0xff800000;
      auVar225._16_4_ = 0xff800000;
      auVar225._20_4_ = 0xff800000;
      auVar225._24_4_ = 0xff800000;
      auVar225._28_4_ = 0xff800000;
      auVar244 = vblendvps_avx(auVar29,auVar225,auVar244);
      _local_720 = vmaxps_avx(auVar146,auVar244);
      auVar244 = vcmpps_avx(auVar88,auVar210,6);
      auVar244 = vorps_avx(auVar87,auVar244);
      auVar244 = vblendvps_avx(auVar29,auVar265,auVar244);
      auVar94 = vandps_avx(local_2a0,auVar94);
      local_3e0 = vminps_avx(auVar266,auVar244);
      auVar244 = vcmpps_avx(_local_720,local_3e0,2);
      auVar87 = auVar94 & auVar244;
      if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar87 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar87 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar87 >> 0x7f,0) == '\0') &&
            (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar87 >> 0xbf,0) == '\0') &&
          (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar87[0x1f])
      goto LAB_01636073;
      auVar87 = vminps_avx(local_440,auVar258);
      auVar266 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar87 = vmaxps_avx(auVar87,auVar266);
      auVar146 = vminps_avx(local_460,auVar258);
      auVar146 = vmaxps_avx(auVar146,auVar266);
      auVar31._4_4_ = (auVar87._4_4_ + 1.0) * 0.125;
      auVar31._0_4_ = (auVar87._0_4_ + 0.0) * 0.125;
      auVar31._8_4_ = (auVar87._8_4_ + 2.0) * 0.125;
      auVar31._12_4_ = (auVar87._12_4_ + 3.0) * 0.125;
      auVar31._16_4_ = (auVar87._16_4_ + 4.0) * 0.125;
      auVar31._20_4_ = (auVar87._20_4_ + 5.0) * 0.125;
      auVar31._24_4_ = (auVar87._24_4_ + 6.0) * 0.125;
      auVar31._28_4_ = auVar87._28_4_ + 7.0;
      auVar179 = vfmadd213ps_fma(auVar31,local_640,local_8e0);
      auVar32._4_4_ = (auVar146._4_4_ + 1.0) * 0.125;
      auVar32._0_4_ = (auVar146._0_4_ + 0.0) * 0.125;
      auVar32._8_4_ = (auVar146._8_4_ + 2.0) * 0.125;
      auVar32._12_4_ = (auVar146._12_4_ + 3.0) * 0.125;
      auVar32._16_4_ = (auVar146._16_4_ + 4.0) * 0.125;
      auVar32._20_4_ = (auVar146._20_4_ + 5.0) * 0.125;
      auVar32._24_4_ = (auVar146._24_4_ + 6.0) * 0.125;
      auVar32._28_4_ = auVar146._28_4_ + 7.0;
      auVar228 = vfmadd213ps_fma(auVar32,local_640,local_8e0);
      auVar87 = vminps_avx(auVar215,local_8a0);
      auVar146 = vminps_avx(local_880,local_660);
      auVar211 = ZEXT3264(auVar146);
      auVar87 = vminps_avx(auVar87,auVar146);
      auVar87 = vsubps_avx(auVar87,auVar8);
      auVar94 = vandps_avx(auVar244,auVar94);
      local_440 = ZEXT1632(auVar179);
      local_460 = ZEXT1632(auVar228);
      auVar33._4_4_ = auVar87._4_4_ * 0.99999976;
      auVar33._0_4_ = auVar87._0_4_ * 0.99999976;
      auVar33._8_4_ = auVar87._8_4_ * 0.99999976;
      auVar33._12_4_ = auVar87._12_4_ * 0.99999976;
      auVar33._16_4_ = auVar87._16_4_ * 0.99999976;
      auVar33._20_4_ = auVar87._20_4_ * 0.99999976;
      auVar33._24_4_ = auVar87._24_4_ * 0.99999976;
      auVar33._28_4_ = 0x3f7ffffc;
      auVar244 = vmaxps_avx(ZEXT832(0) << 0x20,auVar33);
      auVar34._4_4_ = auVar244._4_4_ * auVar244._4_4_;
      auVar34._0_4_ = auVar244._0_4_ * auVar244._0_4_;
      auVar34._8_4_ = auVar244._8_4_ * auVar244._8_4_;
      auVar34._12_4_ = auVar244._12_4_ * auVar244._12_4_;
      auVar34._16_4_ = auVar244._16_4_ * auVar244._16_4_;
      auVar34._20_4_ = auVar244._20_4_ * auVar244._20_4_;
      auVar34._24_4_ = auVar244._24_4_ * auVar244._24_4_;
      auVar34._28_4_ = auVar244._28_4_;
      auVar87 = vsubps_avx(local_680,auVar34);
      auVar35._4_4_ = auVar87._4_4_ * fVar151 * 4.0;
      auVar35._0_4_ = auVar87._0_4_ * fVar150 * 4.0;
      auVar35._8_4_ = auVar87._8_4_ * fStack_5b8;
      auVar35._12_4_ = auVar87._12_4_ * fStack_5b4;
      auVar35._16_4_ = auVar87._16_4_ * fStack_5b0;
      auVar35._20_4_ = auVar87._20_4_ * fStack_5ac;
      auVar35._24_4_ = auVar87._24_4_ * fStack_5a8;
      auVar35._28_4_ = auVar244._28_4_;
      auVar244 = vsubps_avx(local_6a0,auVar35);
      local_ae0 = vcmpps_avx(auVar244,ZEXT1232(ZEXT812(0)) << 0x20,5);
      if ((((((((local_ae0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_ae0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_ae0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_ae0 >> 0x7f,0) == '\0') &&
            (local_ae0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_ae0 >> 0xbf,0) == '\0') &&
          (local_ae0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_ae0[0x1f]) {
        auVar144 = SUB6432(ZEXT864(0),0) << 0x20;
        local_780 = ZEXT832(0) << 0x20;
        _local_600 = ZEXT832(0) << 0x20;
        auVar173 = SUB6432(ZEXT864(0),0) << 0x20;
        _local_ac0 = ZEXT832(0) << 0x20;
        auVar199._8_4_ = 0x7f800000;
        auVar199._0_8_ = 0x7f8000007f800000;
        auVar199._12_4_ = 0x7f800000;
        auVar199._16_4_ = 0x7f800000;
        auVar199._20_4_ = 0x7f800000;
        auVar199._24_4_ = 0x7f800000;
        auVar199._28_4_ = 0x7f800000;
        auVar206._8_4_ = 0xff800000;
        auVar206._0_8_ = 0xff800000ff800000;
        auVar206._12_4_ = 0xff800000;
        auVar206._16_4_ = 0xff800000;
        auVar206._20_4_ = 0xff800000;
        auVar206._24_4_ = 0xff800000;
        auVar206._28_4_ = 0xff800000;
        local_5e0 = local_780;
      }
      else {
        auVar145._0_4_ = fVar150 + fVar150;
        auVar145._4_4_ = fVar151 + fVar151;
        auVar145._8_4_ = fVar152 + fVar152;
        auVar145._12_4_ = fVar153 + fVar153;
        auVar145._16_4_ = fVar237 + fVar237;
        auVar145._20_4_ = fVar238 + fVar238;
        auVar145._24_4_ = fVar246 + fVar246;
        auVar145._28_4_ = fVar100 + fVar100;
        auVar146 = vrcpps_avx(auVar145);
        auVar179 = vfnmadd213ps_fma(auVar145,auVar146,auVar258);
        auVar179 = vfmadd132ps_fma(ZEXT1632(auVar179),auVar146,auVar146);
        auVar146 = vsqrtps_avx(auVar244);
        auVar185._0_8_ = auVar224._0_8_ ^ 0x8000000080000000;
        auVar185._8_4_ = -auVar224._8_4_;
        auVar185._12_4_ = -auVar224._12_4_;
        auVar185._16_4_ = -auVar224._16_4_;
        auVar185._20_4_ = -auVar224._20_4_;
        auVar185._24_4_ = -auVar224._24_4_;
        auVar185._28_4_ = -auVar224._28_4_;
        auVar266 = vsubps_avx(auVar185,auVar146);
        auVar146 = vsubps_avx(auVar146,auVar224);
        fVar150 = auVar266._0_4_ * auVar179._0_4_;
        fVar271 = auVar266._4_4_ * auVar179._4_4_;
        auVar36._4_4_ = fVar271;
        auVar36._0_4_ = fVar150;
        fVar272 = auVar266._8_4_ * auVar179._8_4_;
        auVar36._8_4_ = fVar272;
        fVar274 = auVar266._12_4_ * auVar179._12_4_;
        auVar36._12_4_ = fVar274;
        fVar151 = auVar266._16_4_ * 0.0;
        auVar36._16_4_ = fVar151;
        fVar152 = auVar266._20_4_ * 0.0;
        auVar36._20_4_ = fVar152;
        fVar153 = auVar266._24_4_ * 0.0;
        auVar36._24_4_ = fVar153;
        auVar36._28_4_ = local_2a0._28_4_;
        fVar100 = auVar146._0_4_ * auVar179._0_4_;
        fVar70 = auVar146._4_4_ * auVar179._4_4_;
        auVar37._4_4_ = fVar70;
        auVar37._0_4_ = fVar100;
        fVar219 = auVar146._8_4_ * auVar179._8_4_;
        auVar37._8_4_ = fVar219;
        fVar132 = auVar146._12_4_ * auVar179._12_4_;
        auVar37._12_4_ = fVar132;
        fVar220 = auVar146._16_4_ * 0.0;
        auVar37._16_4_ = fVar220;
        fVar134 = auVar146._20_4_ * 0.0;
        auVar37._20_4_ = fVar134;
        fVar221 = auVar146._24_4_ * 0.0;
        auVar37._24_4_ = fVar221;
        auVar37._28_4_ = 0x3f800000;
        auVar179 = vfmadd213ps_fma(ZEXT1632(auVar81),auVar36,auVar269);
        auVar81 = vfmadd213ps_fma(ZEXT1632(auVar81),auVar37,auVar269);
        auVar38._28_4_ = auVar266._28_4_;
        auVar38._0_28_ =
             ZEXT1628(CONCAT412(fVar135 * auVar179._12_4_,
                                CONCAT48(fVar133 * auVar179._8_4_,
                                         CONCAT44(fVar136 * auVar179._4_4_,fVar131 * auVar179._0_4_)
                                        )));
        auVar146 = ZEXT1632(CONCAT412(fVar135 * auVar81._12_4_,
                                      CONCAT48(fVar133 * auVar81._8_4_,
                                               CONCAT44(fVar136 * auVar81._4_4_,
                                                        fVar131 * auVar81._0_4_))));
        auVar81 = vfmadd213ps_fma(auVar9,auVar38,local_a80);
        auVar179 = vfmadd213ps_fma(auVar9,auVar146,local_a80);
        auVar228 = vfmadd213ps_fma(auVar173,auVar38,auVar85);
        auVar118 = vfmadd213ps_fma(auVar173,auVar146,auVar85);
        auVar6 = vfmadd213ps_fma(auVar38,auVar144,auVar267);
        auVar141 = vfmadd213ps_fma(auVar144,auVar146,auVar267);
        auVar39._4_4_ = fVar271 * (float)local_700._4_4_;
        auVar39._0_4_ = fVar150 * (float)local_700._0_4_;
        auVar39._8_4_ = fVar272 * fStack_6f8;
        auVar39._12_4_ = fVar274 * fStack_6f4;
        auVar39._16_4_ = fVar151 * fStack_6f0;
        auVar39._20_4_ = fVar152 * fStack_6ec;
        auVar39._24_4_ = fVar153 * fStack_6e8;
        auVar39._28_4_ = 0;
        auVar144 = vsubps_avx(auVar39,ZEXT1632(auVar81));
        auVar174._0_4_ = fVar150 * (float)local_6e0._0_4_;
        auVar174._4_4_ = fVar271 * (float)local_6e0._4_4_;
        auVar174._8_4_ = fVar272 * fStack_6d8;
        auVar174._12_4_ = fVar274 * fStack_6d4;
        auVar174._16_4_ = fVar151 * fStack_6d0;
        auVar174._20_4_ = fVar152 * fStack_6cc;
        auVar174._24_4_ = fVar153 * fStack_6c8;
        auVar174._28_4_ = 0;
        auVar173 = vsubps_avx(auVar174,ZEXT1632(auVar228));
        auVar200._0_4_ = local_4a0 * fVar150;
        auVar200._4_4_ = fStack_49c * fVar271;
        auVar200._8_4_ = fStack_498 * fVar272;
        auVar200._12_4_ = fStack_494 * fVar274;
        auVar200._16_4_ = fStack_490 * fVar151;
        auVar200._20_4_ = fStack_48c * fVar152;
        auVar200._24_4_ = fStack_488 * fVar153;
        auVar200._28_4_ = 0;
        _local_ac0 = vsubps_avx(auVar200,ZEXT1632(auVar6));
        auVar40._4_4_ = fVar70 * (float)local_700._4_4_;
        auVar40._0_4_ = fVar100 * (float)local_700._0_4_;
        auVar40._8_4_ = fVar219 * fStack_6f8;
        auVar40._12_4_ = fVar132 * fStack_6f4;
        auVar40._16_4_ = fVar220 * fStack_6f0;
        auVar40._20_4_ = fVar134 * fStack_6ec;
        auVar40._24_4_ = fVar221 * fStack_6e8;
        auVar40._28_4_ = 0;
        local_780 = vsubps_avx(auVar40,ZEXT1632(auVar179));
        auVar41._4_4_ = fVar70 * (float)local_6e0._4_4_;
        auVar41._0_4_ = fVar100 * (float)local_6e0._0_4_;
        auVar41._8_4_ = fVar219 * fStack_6d8;
        auVar41._12_4_ = fVar132 * fStack_6d4;
        auVar41._16_4_ = fVar220 * fStack_6d0;
        auVar41._20_4_ = fVar134 * fStack_6cc;
        auVar41._24_4_ = fVar221 * fStack_6c8;
        auVar41._28_4_ = local_780._28_4_;
        local_5e0 = vsubps_avx(auVar41,ZEXT1632(auVar118));
        auVar42._4_4_ = fStack_49c * fVar70;
        auVar42._0_4_ = local_4a0 * fVar100;
        auVar42._8_4_ = fStack_498 * fVar219;
        auVar42._12_4_ = fStack_494 * fVar132;
        auVar42._16_4_ = fStack_490 * fVar220;
        auVar42._20_4_ = fStack_48c * fVar134;
        auVar42._24_4_ = fStack_488 * fVar221;
        auVar42._28_4_ = local_5e0._28_4_;
        _local_600 = vsubps_avx(auVar42,ZEXT1632(auVar141));
        auVar230 = ZEXT864(0) << 0x20;
        auVar9 = vcmpps_avx(auVar244,_DAT_02020f00,5);
        auVar211 = ZEXT3264(auVar9);
        auVar201._8_4_ = 0x7f800000;
        auVar201._0_8_ = 0x7f8000007f800000;
        auVar201._12_4_ = 0x7f800000;
        auVar201._16_4_ = 0x7f800000;
        auVar201._20_4_ = 0x7f800000;
        auVar201._24_4_ = 0x7f800000;
        auVar201._28_4_ = 0x7f800000;
        auVar199 = vblendvps_avx(auVar201,auVar36,auVar9);
        auVar55._4_4_ = uStack_73c;
        auVar55._0_4_ = local_740;
        auVar55._8_4_ = uStack_738;
        auVar55._12_4_ = uStack_734;
        auVar55._16_4_ = uStack_730;
        auVar55._20_4_ = uStack_72c;
        auVar55._24_4_ = uStack_728;
        auVar55._28_4_ = uStack_724;
        auVar244 = vandps_avx(auVar55,auVar12);
        auVar244 = vmaxps_avx(local_380,auVar244);
        auVar43._4_4_ = auVar244._4_4_ * 1.9073486e-06;
        auVar43._0_4_ = auVar244._0_4_ * 1.9073486e-06;
        auVar43._8_4_ = auVar244._8_4_ * 1.9073486e-06;
        auVar43._12_4_ = auVar244._12_4_ * 1.9073486e-06;
        auVar43._16_4_ = auVar244._16_4_ * 1.9073486e-06;
        auVar43._20_4_ = auVar244._20_4_ * 1.9073486e-06;
        auVar43._24_4_ = auVar244._24_4_ * 1.9073486e-06;
        auVar43._28_4_ = auVar244._28_4_;
        auVar244 = vandps_avx(auVar55,auVar240);
        auVar244 = vcmpps_avx(auVar244,auVar43,1);
        auVar207._8_4_ = 0xff800000;
        auVar207._0_8_ = 0xff800000ff800000;
        auVar207._12_4_ = 0xff800000;
        auVar207._16_4_ = 0xff800000;
        auVar207._20_4_ = 0xff800000;
        auVar207._24_4_ = 0xff800000;
        auVar207._28_4_ = 0xff800000;
        auVar206 = vblendvps_avx(auVar207,auVar37,auVar9);
        auVar240 = auVar9 & auVar244;
        if ((((((((auVar240 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar240 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar240 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar240 >> 0x7f,0) != '\0') ||
              (auVar240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar240 >> 0xbf,0) != '\0') ||
            (auVar240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar240[0x1f] < '\0') {
          auVar244 = vandps_avx(auVar244,auVar9);
          auVar87 = vcmpps_avx(auVar87,ZEXT832(0) << 0x20,2);
          auVar230 = ZEXT3264(auVar87);
          auVar253._8_4_ = 0xff800000;
          auVar253._0_8_ = 0xff800000ff800000;
          auVar253._12_4_ = 0xff800000;
          auVar253._16_4_ = 0xff800000;
          auVar253._20_4_ = 0xff800000;
          auVar253._24_4_ = 0xff800000;
          auVar253._28_4_ = 0xff800000;
          auVar260._8_4_ = 0x7f800000;
          auVar260._0_8_ = 0x7f8000007f800000;
          auVar260._12_4_ = 0x7f800000;
          auVar260._16_4_ = 0x7f800000;
          auVar260._20_4_ = 0x7f800000;
          auVar260._24_4_ = 0x7f800000;
          auVar260._28_4_ = 0x7f800000;
          auVar240 = vblendvps_avx(auVar260,auVar253,auVar87);
          auVar81 = vpackssdw_avx(auVar244._0_16_,auVar244._16_16_);
          auVar146 = vpmovsxwd_avx2(auVar81);
          auVar199 = vblendvps_avx(auVar199,auVar240,auVar146);
          auVar240 = vblendvps_avx(auVar253,auVar260,auVar87);
          auVar206 = vblendvps_avx(auVar206,auVar240,auVar146);
          auVar218._0_8_ = auVar244._0_8_ ^ 0xffffffffffffffff;
          auVar218._8_4_ = auVar244._8_4_ ^ 0xffffffff;
          auVar218._12_4_ = auVar244._12_4_ ^ 0xffffffff;
          auVar218._16_4_ = auVar244._16_4_ ^ 0xffffffff;
          auVar218._20_4_ = auVar244._20_4_ ^ 0xffffffff;
          auVar218._24_4_ = auVar244._24_4_ ^ 0xffffffff;
          auVar218._28_4_ = auVar244._28_4_ ^ 0xffffffff;
          auVar244 = vorps_avx(auVar87,auVar218);
          local_ae0 = vandps_avx(auVar244,auVar9);
        }
      }
      uVar68 = *(undefined4 *)&(ray->dir).field_0;
      auVar259._4_4_ = uVar68;
      auVar259._0_4_ = uVar68;
      auVar259._8_4_ = uVar68;
      auVar259._12_4_ = uVar68;
      auVar259._16_4_ = uVar68;
      auVar259._20_4_ = uVar68;
      auVar259._24_4_ = uVar68;
      auVar259._28_4_ = uVar68;
      uVar68 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      local_520._4_4_ = uVar68;
      local_520._0_4_ = uVar68;
      local_520._8_4_ = uVar68;
      local_520._12_4_ = uVar68;
      local_520._16_4_ = uVar68;
      local_520._20_4_ = uVar68;
      local_520._24_4_ = uVar68;
      local_520._28_4_ = uVar68;
      local_9c0._4_4_ = (ray->dir).field_0.m128[2];
      local_3c0 = _local_720;
      local_3a0 = vminps_avx(local_3e0,auVar199);
      _local_500 = vmaxps_avx(_local_720,auVar206);
      _local_400 = _local_500;
      auVar244 = vcmpps_avx(_local_720,local_3a0,2);
      local_4c0 = vandps_avx(auVar244,auVar94);
      auVar244 = vcmpps_avx(_local_500,local_3e0,2);
      local_5a0 = vandps_avx(auVar244,auVar94);
      auVar94 = vorps_avx(local_5a0,local_4c0);
      auVar245 = ZEXT3264(local_960);
      auVar254 = ZEXT3264(local_980);
      if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar94 >> 0x7f,0) == '\0') &&
            (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar94 >> 0xbf,0) == '\0') &&
          (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar94[0x1f])
      {
        auVar202 = ZEXT3264(local_900);
      }
      else {
        local_560._0_8_ = local_ae0._0_8_ ^ 0xffffffffffffffff;
        local_560._8_4_ = local_ae0._8_4_ ^ 0xffffffff;
        local_560._12_4_ = local_ae0._12_4_ ^ 0xffffffff;
        local_560._16_4_ = local_ae0._16_4_ ^ 0xffffffff;
        local_560._20_4_ = local_ae0._20_4_ ^ 0xffffffff;
        local_560._24_4_ = local_ae0._24_4_ ^ 0xffffffff;
        local_560._28_4_ = local_ae0._28_4_ ^ 0xffffffff;
        local_9c0._0_4_ = local_9c0._4_4_;
        fStack_9b8 = (float)local_9c0._4_4_;
        fStack_9b4 = (float)local_9c0._4_4_;
        fStack_9b0 = (float)local_9c0._4_4_;
        fStack_9ac = (float)local_9c0._4_4_;
        fStack_9a8 = (float)local_9c0._4_4_;
        fStack_9a4 = (float)local_9c0._4_4_;
        auVar44._4_4_ = (float)local_9c0._4_4_ * (float)local_ac0._4_4_;
        auVar44._0_4_ = (float)local_9c0._4_4_ * (float)local_ac0._0_4_;
        auVar44._8_4_ = (float)local_9c0._4_4_ * fStack_ab8;
        auVar44._12_4_ = (float)local_9c0._4_4_ * fStack_ab4;
        auVar44._16_4_ = (float)local_9c0._4_4_ * fStack_ab0;
        auVar44._20_4_ = (float)local_9c0._4_4_ * fStack_aac;
        auVar44._24_4_ = (float)local_9c0._4_4_ * fStack_aa8;
        auVar44._28_4_ = local_ae0._28_4_;
        auVar81 = vfmadd213ps_fma(auVar173,local_520,auVar44);
        auVar81 = vfmadd213ps_fma(auVar144,auVar259,ZEXT1632(auVar81));
        auVar56._4_4_ = uStack_73c;
        auVar56._0_4_ = local_740;
        auVar56._8_4_ = uStack_738;
        auVar56._12_4_ = uStack_734;
        auVar56._16_4_ = uStack_730;
        auVar56._20_4_ = uStack_72c;
        auVar56._24_4_ = uStack_728;
        auVar56._28_4_ = uStack_724;
        auVar94 = vandps_avx(ZEXT1632(auVar81),auVar56);
        auVar123._8_4_ = 0x3e99999a;
        auVar123._0_8_ = 0x3e99999a3e99999a;
        auVar123._12_4_ = 0x3e99999a;
        auVar123._16_4_ = 0x3e99999a;
        auVar123._20_4_ = 0x3e99999a;
        auVar123._24_4_ = 0x3e99999a;
        auVar123._28_4_ = 0x3e99999a;
        auVar94 = vcmpps_avx(auVar94,auVar123,1);
        auVar94 = vorps_avx(auVar94,local_560);
        auVar124._8_4_ = 3;
        auVar124._0_8_ = 0x300000003;
        auVar124._12_4_ = 3;
        auVar124._16_4_ = 3;
        auVar124._20_4_ = 3;
        auVar124._24_4_ = 3;
        auVar124._28_4_ = 3;
        auVar147._8_4_ = 2;
        auVar147._0_8_ = 0x200000002;
        auVar147._12_4_ = 2;
        auVar147._16_4_ = 2;
        auVar147._20_4_ = 2;
        auVar147._24_4_ = 2;
        auVar147._28_4_ = 2;
        auVar94 = vblendvps_avx(auVar147,auVar124,auVar94);
        uVar68 = (undefined4)local_5c0;
        local_340._4_4_ = uVar68;
        local_340._0_4_ = uVar68;
        local_340._8_4_ = uVar68;
        local_340._12_4_ = uVar68;
        local_340._16_4_ = uVar68;
        local_340._20_4_ = uVar68;
        local_340._24_4_ = uVar68;
        local_340._28_4_ = uVar68;
        local_4e0 = vpcmpgtd_avx2(auVar94,local_340);
        local_580 = vpandn_avx2(local_4e0,local_4c0);
        auVar202 = ZEXT3264(local_580);
        auVar94 = local_4c0 & ~local_4e0;
        auVar196 = _local_9c0;
        local_540 = local_5a0;
        if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar94 >> 0x7f,0) != '\0') ||
              (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar94 >> 0xbf,0) != '\0') ||
            (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar94[0x1f] < '\0') {
          auVar179 = vminps_avx(local_a00,local_a20);
          auVar81 = vmaxps_avx(local_a00,local_a20);
          auVar228 = vminps_avx(local_a10,_local_a30);
          auVar118 = vminps_avx(auVar179,auVar228);
          auVar179 = vmaxps_avx(local_a10,_local_a30);
          auVar228 = vmaxps_avx(auVar81,auVar179);
          auVar81 = vandps_avx(auVar118,local_a40);
          auVar179 = vandps_avx(auVar228,local_a40);
          auVar81 = vmaxps_avx(auVar81,auVar179);
          auVar179 = vmovshdup_avx(auVar81);
          auVar179 = vmaxss_avx(auVar179,auVar81);
          auVar81 = vshufpd_avx(auVar81,auVar81,1);
          auVar81 = vmaxss_avx(auVar81,auVar179);
          local_820._4_24_ = auVar203._4_24_;
          local_820._0_4_ = auVar81._0_4_ * 1.9073486e-06;
          local_820._28_4_ = 0;
          _local_6c0 = vshufps_avx(auVar228,auVar228,0xff);
          _auStack_6b0 = auVar8._16_16_;
          local_760._4_4_ = (float)local_720._4_4_ + (float)local_860._4_4_;
          local_760._0_4_ = (float)local_720._0_4_ + (float)local_860._0_4_;
          fStack_758 = fStack_718 + fStack_858;
          fStack_754 = fStack_714 + fStack_854;
          fStack_750 = fStack_710 + fStack_850;
          fStack_74c = fStack_70c + fStack_84c;
          fStack_748 = fStack_708 + fStack_848;
          fStack_744 = fStack_704 + fStack_844;
          local_8a0 = auVar259;
          do {
            auVar125._8_4_ = 0x7f800000;
            auVar125._0_8_ = 0x7f8000007f800000;
            auVar125._12_4_ = 0x7f800000;
            auVar125._16_4_ = 0x7f800000;
            auVar125._20_4_ = 0x7f800000;
            auVar125._24_4_ = 0x7f800000;
            auVar125._28_4_ = 0x7f800000;
            auVar94 = auVar202._0_32_;
            auVar244 = vblendvps_avx(auVar125,_local_720,auVar94);
            auVar8 = vshufps_avx(auVar244,auVar244,0xb1);
            auVar8 = vminps_avx(auVar244,auVar8);
            auVar240 = vshufpd_avx(auVar8,auVar8,5);
            auVar8 = vminps_avx(auVar8,auVar240);
            auVar240 = vpermpd_avx2(auVar8,0x4e);
            auVar8 = vminps_avx(auVar8,auVar240);
            auVar244 = vcmpps_avx(auVar244,auVar8,0);
            auVar8 = auVar94 & auVar244;
            if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar8 >> 0x7f,0) != '\0') ||
                  (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar8 >> 0xbf,0) != '\0') ||
                (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar8[0x1f] < '\0') {
              auVar94 = vandps_avx(auVar244,auVar94);
            }
            uVar64 = vmovmskps_avx(auVar94);
            iVar11 = 0;
            for (; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x80000000) {
              iVar11 = iVar11 + 1;
            }
            uVar64 = iVar11 << 2;
            *(undefined4 *)(local_580 + uVar64) = 0;
            aVar1 = (ray->dir).field_0;
            local_800._0_16_ = (undefined1  [16])aVar1;
            auVar81 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            local_a80._0_16_ = ZEXT416(*(uint *)(local_440 + uVar64));
            _local_ac0 = ZEXT416(*(uint *)(local_3c0 + uVar64));
            if (auVar81._0_4_ < 0.0) {
              fVar100 = sqrtf(auVar81._0_4_);
            }
            else {
              auVar81 = vsqrtss_avx(auVar81,auVar81);
              fVar100 = auVar81._0_4_;
            }
            local_640._0_4_ = fVar100 * 1.9073486e-06;
            lVar66 = 5;
            do {
              fVar70 = local_a80._0_4_;
              fVar100 = 1.0 - fVar70;
              auVar104._0_4_ = local_a20._0_4_ * fVar70;
              auVar104._4_4_ = local_a20._4_4_ * fVar70;
              auVar104._8_4_ = local_a20._8_4_ * fVar70;
              auVar104._12_4_ = local_a20._12_4_ * fVar70;
              auVar138._4_4_ = fVar100;
              auVar138._0_4_ = fVar100;
              auVar138._8_4_ = fVar100;
              auVar138._12_4_ = fVar100;
              auVar81 = vfmadd231ps_fma(auVar104,auVar138,local_a00);
              auVar155._0_4_ = local_a10._0_4_ * fVar70;
              auVar155._4_4_ = local_a10._4_4_ * fVar70;
              auVar155._8_4_ = local_a10._8_4_ * fVar70;
              auVar155._12_4_ = local_a10._12_4_ * fVar70;
              auVar179 = vfmadd231ps_fma(auVar155,auVar138,local_a20);
              auVar192._0_4_ = fVar70 * auVar179._0_4_;
              auVar192._4_4_ = fVar70 * auVar179._4_4_;
              auVar192._8_4_ = fVar70 * auVar179._8_4_;
              auVar192._12_4_ = fVar70 * auVar179._12_4_;
              local_9a0._0_16_ = vfmadd231ps_fma(auVar192,auVar138,auVar81);
              auVar105._0_4_ = fVar70 * (float)local_a30._0_4_;
              auVar105._4_4_ = fVar70 * (float)local_a30._4_4_;
              auVar105._8_4_ = fVar70 * fStack_a28;
              auVar105._12_4_ = fVar70 * fStack_a24;
              auVar81 = vfmadd231ps_fma(auVar105,auVar138,local_a10);
              auVar178._0_4_ = fVar70 * auVar81._0_4_;
              auVar178._4_4_ = fVar70 * auVar81._4_4_;
              auVar178._8_4_ = fVar70 * auVar81._8_4_;
              auVar178._12_4_ = fVar70 * auVar81._12_4_;
              auVar179 = vfmadd231ps_fma(auVar178,auVar138,auVar179);
              auVar106._4_4_ = local_ac0._0_4_;
              auVar106._0_4_ = local_ac0._0_4_;
              auVar106._8_4_ = local_ac0._0_4_;
              auVar106._12_4_ = local_ac0._0_4_;
              auVar81 = vfmadd213ps_fma(auVar106,local_800._0_16_,_DAT_01feba10);
              auVar77._0_4_ = fVar70 * auVar179._0_4_;
              auVar77._4_4_ = fVar70 * auVar179._4_4_;
              auVar77._8_4_ = fVar70 * auVar179._8_4_;
              auVar77._12_4_ = fVar70 * auVar179._12_4_;
              auVar228 = vfmadd231ps_fma(auVar77,local_9a0._0_16_,auVar138);
              local_620._0_16_ = auVar228;
              auVar81 = vsubps_avx(auVar81,auVar228);
              _local_840 = auVar81;
              auVar81 = vdpps_avx(auVar81,auVar81,0x7f);
              local_7e0._0_16_ = auVar81;
              if (auVar81._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416((uint)fVar100);
                local_a60._0_16_ = auVar179;
                auVar254._0_4_ = sqrtf(auVar81._0_4_);
                auVar254._4_60_ = extraout_var;
                auVar81 = auVar254._0_16_;
                auVar179 = local_a60._0_16_;
                auVar228 = local_ae0._0_16_;
              }
              else {
                auVar81 = vsqrtss_avx(auVar81,auVar81);
                auVar228 = ZEXT416((uint)fVar100);
              }
              auVar179 = vsubps_avx(auVar179,local_9a0._0_16_);
              local_9a0._0_4_ = auVar179._0_4_ * 3.0;
              local_9a0._4_4_ = auVar179._4_4_ * 3.0;
              local_9a0._8_4_ = auVar179._8_4_ * 3.0;
              local_9a0._12_4_ = auVar179._12_4_ * 3.0;
              auVar179 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar228,local_a80._0_16_);
              auVar118 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_,auVar228);
              fVar100 = auVar228._0_4_ * 6.0;
              fVar70 = auVar179._0_4_ * 6.0;
              fVar131 = auVar118._0_4_ * 6.0;
              fVar219 = local_a80._0_4_ * 6.0;
              auVar156._0_4_ = fVar219 * (float)local_a30._0_4_;
              auVar156._4_4_ = fVar219 * (float)local_a30._4_4_;
              auVar156._8_4_ = fVar219 * fStack_a28;
              auVar156._12_4_ = fVar219 * fStack_a24;
              auVar107._4_4_ = fVar131;
              auVar107._0_4_ = fVar131;
              auVar107._8_4_ = fVar131;
              auVar107._12_4_ = fVar131;
              auVar179 = vfmadd132ps_fma(auVar107,auVar156,local_a10);
              auVar157._4_4_ = fVar70;
              auVar157._0_4_ = fVar70;
              auVar157._8_4_ = fVar70;
              auVar157._12_4_ = fVar70;
              auVar179 = vfmadd132ps_fma(auVar157,auVar179,local_a20);
              auVar228 = vdpps_avx(local_9a0._0_16_,local_9a0._0_16_,0x7f);
              auVar108._4_4_ = fVar100;
              auVar108._0_4_ = fVar100;
              auVar108._8_4_ = fVar100;
              auVar108._12_4_ = fVar100;
              auVar6 = vfmadd132ps_fma(auVar108,auVar179,local_a00);
              auVar179 = vblendps_avx(auVar228,_DAT_01feba10,0xe);
              auVar118 = vrsqrtss_avx(auVar179,auVar179);
              fVar131 = auVar228._0_4_;
              fVar100 = auVar118._0_4_;
              auVar118 = vdpps_avx(local_9a0._0_16_,auVar6,0x7f);
              fVar100 = fVar100 * 1.5 + fVar131 * -0.5 * fVar100 * fVar100 * fVar100;
              auVar109._0_4_ = auVar6._0_4_ * fVar131;
              auVar109._4_4_ = auVar6._4_4_ * fVar131;
              auVar109._8_4_ = auVar6._8_4_ * fVar131;
              auVar109._12_4_ = auVar6._12_4_ * fVar131;
              fVar70 = auVar118._0_4_;
              auVar193._0_4_ = local_9a0._0_4_ * fVar70;
              auVar193._4_4_ = local_9a0._4_4_ * fVar70;
              auVar193._8_4_ = local_9a0._8_4_ * fVar70;
              auVar193._12_4_ = local_9a0._12_4_ * fVar70;
              auVar118 = vsubps_avx(auVar109,auVar193);
              auVar179 = vrcpss_avx(auVar179,auVar179);
              auVar6 = vfnmadd213ss_fma(auVar179,auVar228,ZEXT416(0x40000000));
              fVar70 = auVar179._0_4_ * auVar6._0_4_;
              auVar179 = vmaxss_avx(ZEXT416((uint)local_820._0_4_),
                                    ZEXT416((uint)((float)local_ac0._0_4_ * (float)local_640._0_4_))
                                   );
              local_ae0._0_4_ = auVar179._0_4_;
              uVar69 = CONCAT44(local_9a0._4_4_,local_9a0._0_4_);
              auVar229._0_8_ = uVar69 ^ 0x8000000080000000;
              auVar229._8_4_ = -local_9a0._8_4_;
              auVar229._12_4_ = -local_9a0._12_4_;
              auVar158._0_4_ = fVar100 * auVar118._0_4_ * fVar70;
              auVar158._4_4_ = fVar100 * auVar118._4_4_ * fVar70;
              auVar158._8_4_ = fVar100 * auVar118._8_4_ * fVar70;
              auVar158._12_4_ = fVar100 * auVar118._12_4_ * fVar70;
              local_8e0._0_4_ = local_9a0._0_4_ * fVar100;
              local_8e0._4_4_ = local_9a0._4_4_ * fVar100;
              local_8e0._8_4_ = local_9a0._8_4_ * fVar100;
              local_8e0._12_4_ = local_9a0._12_4_ * fVar100;
              if (fVar131 < -fVar131) {
                local_a60._0_4_ = auVar81._0_4_;
                local_8c0._0_16_ = auVar229;
                local_880._0_16_ = auVar158;
                fVar100 = sqrtf(fVar131);
                auVar81 = ZEXT416((uint)local_a60._0_4_);
                auVar158 = local_880._0_16_;
                auVar229 = local_8c0._0_16_;
              }
              else {
                auVar179 = vsqrtss_avx(auVar228,auVar228);
                fVar100 = auVar179._0_4_;
              }
              local_a60._0_16_ = vdpps_avx(_local_840,local_8e0._0_16_,0x7f);
              auVar6 = vfmadd213ss_fma(ZEXT416((uint)local_820._0_4_),auVar81,
                                       ZEXT416((uint)local_ae0._0_4_));
              auVar179 = vdpps_avx(auVar229,local_8e0._0_16_,0x7f);
              auVar228 = vdpps_avx(_local_840,auVar158,0x7f);
              auVar118 = vdpps_avx(local_800._0_16_,local_8e0._0_16_,0x7f);
              auVar81 = vfmadd213ss_fma(ZEXT416((uint)(auVar81._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_820._0_4_ / fVar100)),auVar6);
              local_8c0._0_4_ = auVar81._0_4_;
              fVar100 = auVar179._0_4_ + auVar228._0_4_;
              auVar211 = ZEXT464((uint)fVar100);
              auVar78._0_4_ = local_a60._0_4_ * local_a60._0_4_;
              auVar78._4_4_ = local_a60._4_4_ * local_a60._4_4_;
              auVar78._8_4_ = local_a60._8_4_ * local_a60._8_4_;
              auVar78._12_4_ = local_a60._12_4_ * local_a60._12_4_;
              auVar81 = vdpps_avx(_local_840,auVar229,0x7f);
              auVar228 = vsubps_avx(local_7e0._0_16_,auVar78);
              auVar179 = vrsqrtss_avx(auVar228,auVar228);
              fVar131 = auVar228._0_4_;
              fVar70 = auVar179._0_4_;
              fVar70 = fVar70 * 1.5 + fVar131 * -0.5 * fVar70 * fVar70 * fVar70;
              auVar179 = vdpps_avx(_local_840,local_800._0_16_,0x7f);
              local_8e0._0_16_ = ZEXT416((uint)fVar100);
              auVar81 = vfnmadd231ss_fma(auVar81,local_a60._0_16_,ZEXT416((uint)fVar100));
              auVar179 = vfnmadd231ss_fma(auVar179,local_a60._0_16_,auVar118);
              if (fVar131 < 0.0) {
                local_880._0_16_ = auVar118;
                local_660._0_16_ = auVar81;
                local_680._0_4_ = fVar70;
                local_6a0._0_16_ = auVar179;
                auVar211 = ZEXT464((uint)fVar100);
                fVar100 = sqrtf(fVar131);
                fVar70 = (float)local_680._0_4_;
                auVar179 = local_6a0._0_16_;
                auVar81 = local_660._0_16_;
                auVar118 = local_880._0_16_;
              }
              else {
                auVar228 = vsqrtss_avx(auVar228,auVar228);
                fVar100 = auVar228._0_4_;
              }
              auVar230 = ZEXT3264(local_960);
              auVar228 = vpermilps_avx(local_620._0_16_,0xff);
              auVar6 = vpermilps_avx(local_9a0._0_16_,0xff);
              auVar81 = vfmsub213ss_fma(auVar81,ZEXT416((uint)fVar70),auVar6);
              auVar159._0_8_ = auVar118._0_8_ ^ 0x8000000080000000;
              auVar159._8_4_ = auVar118._8_4_ ^ 0x80000000;
              auVar159._12_4_ = auVar118._12_4_ ^ 0x80000000;
              auVar180._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
              auVar180._8_4_ = auVar81._8_4_ ^ 0x80000000;
              auVar180._12_4_ = auVar81._12_4_ ^ 0x80000000;
              auVar141 = ZEXT416((uint)(auVar179._0_4_ * fVar70));
              auVar179 = vfmsub231ss_fma(ZEXT416((uint)(auVar118._0_4_ * auVar81._0_4_)),
                                         local_8e0._0_16_,auVar141);
              auVar81 = vinsertps_avx(auVar141,auVar159,0x10);
              uVar68 = auVar179._0_4_;
              auVar160._4_4_ = uVar68;
              auVar160._0_4_ = uVar68;
              auVar160._8_4_ = uVar68;
              auVar160._12_4_ = uVar68;
              auVar81 = vdivps_avx(auVar81,auVar160);
              auVar118 = ZEXT416((uint)(fVar100 - auVar228._0_4_));
              auVar228 = vinsertps_avx(local_a60._0_16_,auVar118,0x10);
              auVar139._0_4_ = auVar228._0_4_ * auVar81._0_4_;
              auVar139._4_4_ = auVar228._4_4_ * auVar81._4_4_;
              auVar139._8_4_ = auVar228._8_4_ * auVar81._8_4_;
              auVar139._12_4_ = auVar228._12_4_ * auVar81._12_4_;
              auVar81 = vinsertps_avx(auVar180,local_8e0._0_16_,0x1c);
              auVar81 = vdivps_avx(auVar81,auVar160);
              auVar179 = vhaddps_avx(auVar139,auVar139);
              auVar161._0_4_ = auVar228._0_4_ * auVar81._0_4_;
              auVar161._4_4_ = auVar228._4_4_ * auVar81._4_4_;
              auVar161._8_4_ = auVar228._8_4_ * auVar81._8_4_;
              auVar161._12_4_ = auVar228._12_4_ * auVar81._12_4_;
              auVar81 = vhaddps_avx(auVar161,auVar161);
              fVar70 = (float)local_a80._0_4_ - auVar179._0_4_;
              local_a80._0_16_ = ZEXT416((uint)fVar70);
              fVar100 = (float)local_ac0._0_4_ - auVar81._0_4_;
              _local_ac0 = ZEXT416((uint)fVar100);
              auVar81 = vandps_avx(local_a60._0_16_,local_a40);
              bVar30 = true;
              auVar196 = local_9c0._0_28_;
              if ((float)local_8c0._0_4_ <= auVar81._0_4_) {
LAB_01636d4e:
                auVar254 = ZEXT3264(local_980);
                auVar245 = ZEXT3264(local_960);
              }
              else {
                auVar179 = vfmadd231ss_fma(ZEXT416((uint)((float)local_8c0._0_4_ +
                                                         (float)local_ae0._0_4_)),_local_6c0,
                                           ZEXT416(0x36000000));
                auVar81 = vandps_avx(auVar118,local_a40);
                if (auVar179._0_4_ <= auVar81._0_4_) goto LAB_01636d4e;
                fVar100 = fVar100 + (float)local_7c0._0_4_;
                bVar30 = false;
                _local_ac0 = ZEXT416((uint)fVar100);
                if ((fVar100 < (ray->org).field_0.m128[3]) || (ray->tfar < fVar100)) {
                  unaff_R13B = 0;
                  goto LAB_01636d4e;
                }
                bVar30 = false;
                auVar245 = ZEXT3264(local_960);
                if ((fVar70 < 0.0) || (1.0 < fVar70)) {
                  unaff_R13B = 0;
                  goto LAB_01636d4e;
                }
                local_ae0._0_4_ = ray->tfar;
                auVar81 = vrsqrtss_avx(local_7e0._0_16_,local_7e0._0_16_);
                fVar131 = auVar81._0_4_;
                pGVar4 = (local_ae8->scene->geometries).items[local_a88].ptr;
                auVar254 = ZEXT3264(local_980);
                if ((pGVar4->mask & ray->mask) == 0) {
                  bVar30 = false;
                  unaff_R13B = 0;
                  goto LAB_01636d4e;
                }
                if ((local_ae8->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  unaff_R13B = 1;
                }
                else {
                  fVar131 = fVar131 * 1.5 + local_7e0._0_4_ * -0.5 * fVar131 * fVar131 * fVar131;
                  auVar110._0_4_ = fVar131 * (float)local_840._0_4_;
                  auVar110._4_4_ = fVar131 * (float)local_840._4_4_;
                  auVar110._8_4_ = fVar131 * fStack_838;
                  auVar110._12_4_ = fVar131 * fStack_834;
                  auVar118 = vfmadd213ps_fma(auVar6,auVar110,local_9a0._0_16_);
                  auVar81 = vshufps_avx(auVar110,auVar110,0xc9);
                  auVar179 = vshufps_avx(local_9a0._0_16_,local_9a0._0_16_,0xc9);
                  auVar111._0_4_ = auVar110._0_4_ * auVar179._0_4_;
                  auVar111._4_4_ = auVar110._4_4_ * auVar179._4_4_;
                  auVar111._8_4_ = auVar110._8_4_ * auVar179._8_4_;
                  auVar111._12_4_ = auVar110._12_4_ * auVar179._12_4_;
                  auVar228 = vfmsub231ps_fma(auVar111,local_9a0._0_16_,auVar81);
                  auVar81 = vshufps_avx(auVar228,auVar228,0xc9);
                  auVar179 = vshufps_avx(auVar118,auVar118,0xc9);
                  auVar228 = vshufps_avx(auVar228,auVar228,0xd2);
                  auVar79._0_4_ = auVar118._0_4_ * auVar228._0_4_;
                  auVar79._4_4_ = auVar118._4_4_ * auVar228._4_4_;
                  auVar79._8_4_ = auVar118._8_4_ * auVar228._8_4_;
                  auVar79._12_4_ = auVar118._12_4_ * auVar228._12_4_;
                  auVar179 = vfmsub231ps_fma(auVar79,auVar81,auVar179);
                  auVar81 = vshufps_avx(auVar179,auVar179,0xe9);
                  local_930 = vmovlps_avx(auVar81);
                  local_928 = auVar179._0_4_;
                  local_920 = 0;
                  local_91c = local_a8c;
                  local_918 = (undefined4)local_a88;
                  local_914 = local_ae8->user->instID[0];
                  local_910 = local_ae8->user->instPrimID[0];
                  ray->tfar = fVar100;
                  local_aec = -1;
                  local_9f0.valid = &local_aec;
                  local_9f0.geometryUserPtr = pGVar4->userPtr;
                  local_9f0.context = local_ae8->user;
                  local_9f0.hit = (RTCHitN *)&local_930;
                  local_9f0.N = 1;
                  local_9f0.ray = (RTCRayN *)ray;
                  local_924 = fVar70;
                  if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01636ee3:
                    p_Var5 = local_ae8->args->filter;
                    fVar100 = (float)local_ae0._0_4_;
                    if (p_Var5 != (RTCFilterFunctionN)0x0) {
                      if (((local_ae8->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                        auVar211 = ZEXT1664(auVar211._0_16_);
                        auVar230 = ZEXT1664(auVar230._0_16_);
                        (*p_Var5)(&local_9f0);
                        auVar196 = local_9c0._0_28_;
                        auVar254 = ZEXT3264(local_980);
                        auVar245 = ZEXT3264(local_960);
                      }
                      fVar100 = (float)local_ae0._0_4_;
                      if (*local_9f0.valid == 0) {
                        unaff_R13B = 0;
                        goto LAB_01636f67;
                      }
                    }
                    unaff_R13B = 1;
                  }
                  else {
                    auVar211 = ZEXT1664(auVar211._0_16_);
                    auVar230 = ZEXT1664(local_960._0_16_);
                    (*pGVar4->occlusionFilterN)(&local_9f0);
                    auVar196 = local_9c0._0_28_;
                    auVar254 = ZEXT3264(local_980);
                    auVar245 = ZEXT3264(local_960);
                    if (*local_9f0.valid != 0) goto LAB_01636ee3;
                    unaff_R13B = 0;
                    fVar100 = (float)local_ae0._0_4_;
                  }
LAB_01636f67:
                  if (unaff_R13B == 0) {
                    ray->tfar = fVar100;
                  }
                }
                bVar30 = false;
              }
              if (!bVar30) goto LAB_01636f7e;
              lVar66 = lVar66 + -1;
            } while (lVar66 != 0);
            unaff_R13B = 0;
LAB_01636f7e:
            unaff_R13B = unaff_R13B & 1;
            bVar63 = bVar63 | unaff_R13B;
            fVar100 = ray->tfar;
            auVar95._4_4_ = fVar100;
            auVar95._0_4_ = fVar100;
            auVar95._8_4_ = fVar100;
            auVar95._12_4_ = fVar100;
            auVar95._16_4_ = fVar100;
            auVar95._20_4_ = fVar100;
            auVar95._24_4_ = fVar100;
            auVar95._28_4_ = fVar100;
            auVar244 = vcmpps_avx(_local_760,auVar95,2);
            auVar94 = vandps_avx(auVar244,local_580);
            auVar202 = ZEXT3264(auVar94);
            auVar244 = local_580 & auVar244;
            auVar259 = local_8a0;
            local_580 = auVar94;
          } while ((((((((auVar244 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar244 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar244 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar244 >> 0x7f,0) != '\0') ||
                     (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar244 >> 0xbf,0) != '\0') ||
                   (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar244[0x1f] < '\0');
        }
        auVar98._0_4_ = auVar196._0_4_ * (float)local_600._0_4_;
        auVar98._4_4_ = auVar196._4_4_ * (float)local_600._4_4_;
        auVar98._8_4_ = auVar196._8_4_ * fStack_5f8;
        auVar98._12_4_ = auVar196._12_4_ * fStack_5f4;
        auVar98._16_4_ = auVar196._16_4_ * fStack_5f0;
        auVar98._20_4_ = auVar196._20_4_ * fStack_5ec;
        auVar98._28_36_ = auVar202._28_36_;
        auVar98._24_4_ = auVar196._24_4_ * fStack_5e8;
        auVar81 = vfmadd132ps_fma(local_5e0,auVar98._0_32_,local_520);
        auVar81 = vfmadd213ps_fma(local_780,auVar259,ZEXT1632(auVar81));
        auVar57._4_4_ = uStack_73c;
        auVar57._0_4_ = local_740;
        auVar57._8_4_ = uStack_738;
        auVar57._12_4_ = uStack_734;
        auVar57._16_4_ = uStack_730;
        auVar57._20_4_ = uStack_72c;
        auVar57._24_4_ = uStack_728;
        auVar57._28_4_ = uStack_724;
        auVar94 = vandps_avx(ZEXT1632(auVar81),auVar57);
        auVar126._8_4_ = 0x3e99999a;
        auVar126._0_8_ = 0x3e99999a3e99999a;
        auVar126._12_4_ = 0x3e99999a;
        auVar126._16_4_ = 0x3e99999a;
        auVar126._20_4_ = 0x3e99999a;
        auVar126._24_4_ = 0x3e99999a;
        auVar126._28_4_ = 0x3e99999a;
        auVar94 = vcmpps_avx(auVar94,auVar126,1);
        auVar244 = vorps_avx(auVar94,local_560);
        auVar127._0_4_ = (float)local_860._0_4_ + (float)local_500._0_4_;
        auVar127._4_4_ = (float)local_860._4_4_ + (float)local_500._4_4_;
        auVar127._8_4_ = fStack_858 + fStack_4f8;
        auVar127._12_4_ = fStack_854 + fStack_4f4;
        auVar127._16_4_ = fStack_850 + fStack_4f0;
        auVar127._20_4_ = fStack_84c + fStack_4ec;
        auVar127._24_4_ = fStack_848 + fStack_4e8;
        auVar127._28_4_ = fStack_844 + fStack_4e4;
        fVar100 = ray->tfar;
        auVar148._4_4_ = fVar100;
        auVar148._0_4_ = fVar100;
        auVar148._8_4_ = fVar100;
        auVar148._12_4_ = fVar100;
        auVar148._16_4_ = fVar100;
        auVar148._20_4_ = fVar100;
        auVar148._24_4_ = fVar100;
        auVar148._28_4_ = fVar100;
        auVar94 = vcmpps_avx(auVar127,auVar148,2);
        _local_760 = vandps_avx(auVar94,local_540);
        auVar128._8_4_ = 3;
        auVar128._0_8_ = 0x300000003;
        auVar128._12_4_ = 3;
        auVar128._16_4_ = 3;
        auVar128._20_4_ = 3;
        auVar128._24_4_ = 3;
        auVar128._28_4_ = 3;
        auVar149._8_4_ = 2;
        auVar149._0_8_ = 0x200000002;
        auVar149._12_4_ = 2;
        auVar149._16_4_ = 2;
        auVar149._20_4_ = 2;
        auVar149._24_4_ = 2;
        auVar149._28_4_ = 2;
        auVar94 = vblendvps_avx(auVar149,auVar128,auVar244);
        local_780 = vpcmpgtd_avx2(auVar94,local_340);
        auVar94 = vpandn_avx2(local_780,_local_760);
        auVar244 = _local_760 & ~local_780;
        if ((((((((auVar244 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar244 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar244 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar244 >> 0x7f,0) == '\0') &&
              (auVar244 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar244 >> 0xbf,0) == '\0') &&
            (auVar244 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar244[0x1f]) {
          auVar202 = ZEXT3264(local_900);
        }
        else {
          auVar179 = vminps_avx(local_a00,local_a20);
          auVar81 = vmaxps_avx(local_a00,local_a20);
          auVar228 = vminps_avx(local_a10,_local_a30);
          auVar118 = vminps_avx(auVar179,auVar228);
          auVar179 = vmaxps_avx(local_a10,_local_a30);
          auVar228 = vmaxps_avx(auVar81,auVar179);
          auVar81 = vandps_avx(auVar118,local_a40);
          auVar179 = vandps_avx(auVar228,local_a40);
          auVar81 = vmaxps_avx(auVar81,auVar179);
          auVar179 = vmovshdup_avx(auVar81);
          auVar179 = vmaxss_avx(auVar179,auVar81);
          auVar81 = vshufpd_avx(auVar81,auVar81,1);
          auVar81 = vmaxss_avx(auVar81,auVar179);
          local_820._0_4_ = auVar81._0_4_ * 1.9073486e-06;
          local_680._0_16_ = vshufps_avx(auVar228,auVar228,0xff);
          local_6a0 = _local_400;
          local_6c0._4_4_ = (float)local_400._4_4_ + (float)local_860._4_4_;
          local_6c0._0_4_ = (float)local_400._0_4_ + (float)local_860._0_4_;
          fStack_6b8 = fStack_3f8 + fStack_858;
          fStack_6b4 = fStack_3f4 + fStack_854;
          auStack_6b0._0_4_ = fStack_3f0 + fStack_850;
          auStack_6b0._4_4_ = fStack_3ec + fStack_84c;
          fStack_6a8 = fStack_3e8 + fStack_848;
          fStack_6a4 = fStack_3e4 + fStack_844;
          do {
            auVar129._8_4_ = 0x7f800000;
            auVar129._0_8_ = 0x7f8000007f800000;
            auVar129._12_4_ = 0x7f800000;
            auVar129._16_4_ = 0x7f800000;
            auVar129._20_4_ = 0x7f800000;
            auVar129._24_4_ = 0x7f800000;
            auVar129._28_4_ = 0x7f800000;
            auVar244 = vblendvps_avx(auVar129,local_6a0,auVar94);
            auVar8 = vshufps_avx(auVar244,auVar244,0xb1);
            auVar8 = vminps_avx(auVar244,auVar8);
            auVar240 = vshufpd_avx(auVar8,auVar8,5);
            auVar8 = vminps_avx(auVar8,auVar240);
            auVar240 = vpermpd_avx2(auVar8,0x4e);
            auVar8 = vminps_avx(auVar8,auVar240);
            auVar8 = vcmpps_avx(auVar244,auVar8,0);
            auVar240 = auVar94 & auVar8;
            auVar244 = auVar94;
            if ((((((((auVar240 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar240 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar240 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar240 >> 0x7f,0) != '\0') ||
                  (auVar240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar240 >> 0xbf,0) != '\0') ||
                (auVar240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar240[0x1f] < '\0') {
              auVar244 = vandps_avx(auVar8,auVar94);
            }
            uVar64 = vmovmskps_avx(auVar244);
            iVar11 = 0;
            for (; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x80000000) {
              iVar11 = iVar11 + 1;
            }
            uVar64 = iVar11 << 2;
            local_5a0 = auVar94;
            *(undefined4 *)(local_5a0 + uVar64) = 0;
            aVar1 = (ray->dir).field_0;
            local_800._0_16_ = (undefined1  [16])aVar1;
            auVar81 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            auVar261 = ZEXT464(*(uint *)(local_460 + uVar64));
            if (auVar81._0_4_ < 0.0) {
              _local_ac0 = ZEXT416(*(uint *)(local_460 + uVar64));
              local_a80._0_16_ = ZEXT416((uint)*(float *)(local_3e0 + uVar64));
              auVar230 = ZEXT1664(auVar230._0_16_);
              fVar70 = sqrtf(auVar81._0_4_);
              auVar261 = ZEXT1664(_local_ac0);
              fVar100 = (float)local_a80._0_4_;
              uVar68 = local_a80._4_4_;
              uVar273 = local_a80._8_4_;
              uVar275 = local_a80._12_4_;
            }
            else {
              auVar81 = vsqrtss_avx(auVar81,auVar81);
              fVar70 = auVar81._0_4_;
              fVar100 = *(float *)(local_3e0 + uVar64);
              uVar68 = 0;
              uVar273 = 0;
              uVar275 = 0;
            }
            local_640._0_4_ = fVar70 * 1.9073486e-06;
            lVar66 = 5;
            do {
              auVar94 = local_a80;
              fVar131 = auVar261._0_4_;
              fVar70 = 1.0 - fVar131;
              auVar112._0_4_ = local_a20._0_4_ * fVar131;
              auVar112._4_4_ = local_a20._4_4_ * fVar131;
              auVar112._8_4_ = local_a20._8_4_ * fVar131;
              auVar112._12_4_ = local_a20._12_4_ * fVar131;
              auVar140._4_4_ = fVar70;
              auVar140._0_4_ = fVar70;
              auVar140._8_4_ = fVar70;
              auVar140._12_4_ = fVar70;
              auVar81 = vfmadd231ps_fma(auVar112,auVar140,local_a00);
              auVar162._0_4_ = local_a10._0_4_ * fVar131;
              auVar162._4_4_ = local_a10._4_4_ * fVar131;
              auVar162._8_4_ = local_a10._8_4_ * fVar131;
              auVar162._12_4_ = local_a10._12_4_ * fVar131;
              auVar179 = vfmadd231ps_fma(auVar162,auVar140,local_a20);
              auVar194._0_4_ = fVar131 * auVar179._0_4_;
              auVar194._4_4_ = fVar131 * auVar179._4_4_;
              auVar194._8_4_ = fVar131 * auVar179._8_4_;
              auVar194._12_4_ = fVar131 * auVar179._12_4_;
              local_9a0._0_16_ = vfmadd231ps_fma(auVar194,auVar140,auVar81);
              auVar113._0_4_ = fVar131 * (float)local_a30._0_4_;
              auVar113._4_4_ = fVar131 * (float)local_a30._4_4_;
              auVar113._8_4_ = fVar131 * fStack_a28;
              auVar113._12_4_ = fVar131 * fStack_a24;
              auVar81 = vfmadd231ps_fma(auVar113,auVar140,local_a10);
              auVar181._0_4_ = fVar131 * auVar81._0_4_;
              auVar181._4_4_ = fVar131 * auVar81._4_4_;
              auVar181._8_4_ = fVar131 * auVar81._8_4_;
              auVar181._12_4_ = fVar131 * auVar81._12_4_;
              auVar179 = vfmadd231ps_fma(auVar181,auVar140,auVar179);
              auVar114._4_4_ = fVar100;
              auVar114._0_4_ = fVar100;
              auVar114._8_4_ = fVar100;
              auVar114._12_4_ = fVar100;
              auVar81 = vfmadd213ps_fma(auVar114,local_800._0_16_,_DAT_01feba10);
              auVar80._0_4_ = fVar131 * auVar179._0_4_;
              auVar80._4_4_ = fVar131 * auVar179._4_4_;
              auVar80._8_4_ = fVar131 * auVar179._8_4_;
              auVar80._12_4_ = fVar131 * auVar179._12_4_;
              auVar228 = vfmadd231ps_fma(auVar80,local_9a0._0_16_,auVar140);
              local_620._0_16_ = auVar228;
              auVar81 = vsubps_avx(auVar81,auVar228);
              _local_840 = auVar81;
              auVar81 = vdpps_avx(auVar81,auVar81,0x7f);
              _local_ac0 = auVar261._0_16_;
              local_a80._4_4_ = uVar68;
              local_a80._0_4_ = fVar100;
              local_a80._8_4_ = uVar273;
              local_a80._16_16_ = auVar94._16_16_;
              local_a80._12_4_ = uVar275;
              local_7e0._0_16_ = auVar81;
              if (auVar81._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416((uint)fVar70);
                local_a60._0_16_ = auVar179;
                auVar230 = ZEXT1664(auVar230._0_16_);
                auVar99._0_4_ = sqrtf(auVar81._0_4_);
                auVar99._4_60_ = extraout_var_00;
                auVar81 = auVar99._0_16_;
                auVar179 = local_a60._0_16_;
                auVar228 = local_ae0._0_16_;
                auVar118 = _local_ac0;
                fVar100 = (float)local_a80._0_4_;
              }
              else {
                auVar81 = vsqrtss_avx(auVar81,auVar81);
                auVar228 = ZEXT416((uint)fVar70);
                auVar118 = auVar261._0_16_;
              }
              auVar179 = vsubps_avx(auVar179,local_9a0._0_16_);
              local_9a0._0_4_ = auVar179._0_4_ * 3.0;
              local_9a0._4_4_ = auVar179._4_4_ * 3.0;
              local_9a0._8_4_ = auVar179._8_4_ * 3.0;
              local_9a0._12_4_ = auVar179._12_4_ * 3.0;
              auVar179 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar228,auVar118);
              auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar118,auVar228);
              fVar70 = auVar228._0_4_ * 6.0;
              fVar131 = auVar179._0_4_ * 6.0;
              fVar219 = auVar6._0_4_ * 6.0;
              fVar136 = auVar118._0_4_ * 6.0;
              auVar163._0_4_ = fVar136 * (float)local_a30._0_4_;
              auVar163._4_4_ = fVar136 * (float)local_a30._4_4_;
              auVar163._8_4_ = fVar136 * fStack_a28;
              auVar163._12_4_ = fVar136 * fStack_a24;
              auVar115._4_4_ = fVar219;
              auVar115._0_4_ = fVar219;
              auVar115._8_4_ = fVar219;
              auVar115._12_4_ = fVar219;
              auVar179 = vfmadd132ps_fma(auVar115,auVar163,local_a10);
              auVar164._4_4_ = fVar131;
              auVar164._0_4_ = fVar131;
              auVar164._8_4_ = fVar131;
              auVar164._12_4_ = fVar131;
              auVar179 = vfmadd132ps_fma(auVar164,auVar179,local_a20);
              auVar228 = vdpps_avx(local_9a0._0_16_,local_9a0._0_16_,0x7f);
              auVar116._4_4_ = fVar70;
              auVar116._0_4_ = fVar70;
              auVar116._8_4_ = fVar70;
              auVar116._12_4_ = fVar70;
              auVar6 = vfmadd132ps_fma(auVar116,auVar179,local_a00);
              auVar179 = vblendps_avx(auVar228,_DAT_01feba10,0xe);
              auVar118 = vrsqrtss_avx(auVar179,auVar179);
              fVar219 = auVar228._0_4_;
              fVar70 = auVar118._0_4_;
              auVar118 = vdpps_avx(local_9a0._0_16_,auVar6,0x7f);
              fVar70 = fVar70 * 1.5 + fVar219 * -0.5 * fVar70 * fVar70 * fVar70;
              auVar117._0_4_ = auVar6._0_4_ * fVar219;
              auVar117._4_4_ = auVar6._4_4_ * fVar219;
              auVar117._8_4_ = auVar6._8_4_ * fVar219;
              auVar117._12_4_ = auVar6._12_4_ * fVar219;
              fVar131 = auVar118._0_4_;
              auVar195._0_4_ = local_9a0._0_4_ * fVar131;
              auVar195._4_4_ = local_9a0._4_4_ * fVar131;
              auVar195._8_4_ = local_9a0._8_4_ * fVar131;
              auVar195._12_4_ = local_9a0._12_4_ * fVar131;
              auVar118 = vsubps_avx(auVar117,auVar195);
              auVar179 = vrcpss_avx(auVar179,auVar179);
              auVar6 = vfnmadd213ss_fma(auVar179,auVar228,ZEXT416(0x40000000));
              fVar131 = auVar179._0_4_ * auVar6._0_4_;
              auVar179 = vmaxss_avx(ZEXT416((uint)local_820._0_4_),
                                    ZEXT416((uint)(fVar100 * (float)local_640._0_4_)));
              local_ae0._0_4_ = auVar179._0_4_;
              uVar69 = CONCAT44(local_9a0._4_4_,local_9a0._0_4_);
              auVar223._0_8_ = uVar69 ^ 0x8000000080000000;
              auVar223._8_4_ = -local_9a0._8_4_;
              auVar223._12_4_ = -local_9a0._12_4_;
              auVar165._0_4_ = fVar70 * auVar118._0_4_ * fVar131;
              auVar165._4_4_ = fVar70 * auVar118._4_4_ * fVar131;
              auVar165._8_4_ = fVar70 * auVar118._8_4_ * fVar131;
              auVar165._12_4_ = fVar70 * auVar118._12_4_ * fVar131;
              local_8e0._0_4_ = local_9a0._0_4_ * fVar70;
              local_8e0._4_4_ = local_9a0._4_4_ * fVar70;
              local_8e0._8_4_ = local_9a0._8_4_ * fVar70;
              local_8e0._12_4_ = local_9a0._12_4_ * fVar70;
              if (fVar219 < -fVar219) {
                local_a60._0_4_ = auVar81._0_4_;
                local_8c0._0_16_ = auVar223;
                _local_9c0 = auVar165;
                auVar230 = ZEXT1664(auVar230._0_16_);
                fVar100 = sqrtf(fVar219);
                auVar81 = ZEXT416((uint)local_a60._0_4_);
                auVar165 = _local_9c0;
                auVar223 = local_8c0._0_16_;
              }
              else {
                auVar179 = vsqrtss_avx(auVar228,auVar228);
                fVar100 = auVar179._0_4_;
              }
              local_a60._0_16_ = vdpps_avx(_local_840,local_8e0._0_16_,0x7f);
              auVar6 = vfmadd213ss_fma(ZEXT416((uint)local_820._0_4_),auVar81,
                                       ZEXT416((uint)local_ae0._0_4_));
              auVar179 = vdpps_avx(auVar223,local_8e0._0_16_,0x7f);
              auVar228 = vdpps_avx(_local_840,auVar165,0x7f);
              auVar118 = vdpps_avx(local_800._0_16_,local_8e0._0_16_,0x7f);
              auVar81 = vfmadd213ss_fma(ZEXT416((uint)(auVar81._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_820._0_4_ / fVar100)),auVar6);
              local_8c0._0_4_ = auVar81._0_4_;
              fVar100 = auVar179._0_4_ + auVar228._0_4_;
              auVar211 = ZEXT464((uint)fVar100);
              auVar82._0_4_ = local_a60._0_4_ * local_a60._0_4_;
              auVar82._4_4_ = local_a60._4_4_ * local_a60._4_4_;
              auVar82._8_4_ = local_a60._8_4_ * local_a60._8_4_;
              auVar82._12_4_ = local_a60._12_4_ * local_a60._12_4_;
              auVar81 = vdpps_avx(_local_840,auVar223,0x7f);
              auVar228 = vsubps_avx(local_7e0._0_16_,auVar82);
              auVar179 = vrsqrtss_avx(auVar228,auVar228);
              fVar131 = auVar228._0_4_;
              fVar70 = auVar179._0_4_;
              fVar70 = fVar70 * 1.5 + fVar131 * -0.5 * fVar70 * fVar70 * fVar70;
              auVar179 = vdpps_avx(_local_840,local_800._0_16_,0x7f);
              local_8e0._0_16_ = ZEXT416((uint)fVar100);
              auVar81 = vfnmadd231ss_fma(auVar81,local_a60._0_16_,ZEXT416((uint)fVar100));
              auVar179 = vfnmadd231ss_fma(auVar179,local_a60._0_16_,auVar118);
              if (fVar131 < 0.0) {
                _local_9c0 = auVar118;
                local_8a0._0_16_ = auVar81;
                local_880._0_4_ = fVar70;
                local_660._0_16_ = auVar179;
                auVar211 = ZEXT464((uint)fVar100);
                auVar230 = ZEXT1664(auVar230._0_16_);
                fVar100 = sqrtf(fVar131);
                fVar70 = (float)local_880._0_4_;
                auVar179 = local_660._0_16_;
                auVar118 = _local_9c0;
                auVar81 = local_8a0._0_16_;
              }
              else {
                auVar228 = vsqrtss_avx(auVar228,auVar228);
                fVar100 = auVar228._0_4_;
              }
              auVar245 = ZEXT3264(local_960);
              auVar254 = ZEXT3264(local_980);
              auVar228 = vpermilps_avx(local_620._0_16_,0xff);
              auVar6 = vpermilps_avx(local_9a0._0_16_,0xff);
              auVar81 = vfmsub213ss_fma(auVar81,ZEXT416((uint)fVar70),auVar6);
              auVar166._0_8_ = auVar118._0_8_ ^ 0x8000000080000000;
              auVar166._8_4_ = auVar118._8_4_ ^ 0x80000000;
              auVar166._12_4_ = auVar118._12_4_ ^ 0x80000000;
              auVar182._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
              auVar182._8_4_ = auVar81._8_4_ ^ 0x80000000;
              auVar182._12_4_ = auVar81._12_4_ ^ 0x80000000;
              auVar141 = ZEXT416((uint)(auVar179._0_4_ * fVar70));
              auVar179 = vfmsub231ss_fma(ZEXT416((uint)(auVar118._0_4_ * auVar81._0_4_)),
                                         local_8e0._0_16_,auVar141);
              auVar81 = vinsertps_avx(auVar141,auVar166,0x10);
              uVar68 = auVar179._0_4_;
              auVar167._4_4_ = uVar68;
              auVar167._0_4_ = uVar68;
              auVar167._8_4_ = uVar68;
              auVar167._12_4_ = uVar68;
              auVar81 = vdivps_avx(auVar81,auVar167);
              auVar118 = ZEXT416((uint)(fVar100 - auVar228._0_4_));
              auVar228 = vinsertps_avx(local_a60._0_16_,auVar118,0x10);
              auVar142._0_4_ = auVar228._0_4_ * auVar81._0_4_;
              auVar142._4_4_ = auVar228._4_4_ * auVar81._4_4_;
              auVar142._8_4_ = auVar228._8_4_ * auVar81._8_4_;
              auVar142._12_4_ = auVar228._12_4_ * auVar81._12_4_;
              auVar81 = vinsertps_avx(auVar182,local_8e0._0_16_,0x1c);
              auVar81 = vdivps_avx(auVar81,auVar167);
              auVar179 = vhaddps_avx(auVar142,auVar142);
              auVar168._0_4_ = auVar228._0_4_ * auVar81._0_4_;
              auVar168._4_4_ = auVar228._4_4_ * auVar81._4_4_;
              auVar168._8_4_ = auVar228._8_4_ * auVar81._8_4_;
              auVar168._12_4_ = auVar228._12_4_ * auVar81._12_4_;
              auVar81 = vhaddps_avx(auVar168,auVar168);
              fVar70 = (float)local_ac0._0_4_ - auVar179._0_4_;
              auVar261 = ZEXT464((uint)fVar70);
              fVar100 = (float)local_a80._0_4_ - auVar81._0_4_;
              uVar68 = 0;
              uVar273 = 0;
              uVar275 = 0;
              auVar81 = vandps_avx(local_a60._0_16_,local_a40);
              bVar30 = true;
              if ((float)local_8c0._0_4_ <= auVar81._0_4_) {
                auVar202 = ZEXT3264(local_900);
              }
              else {
                auVar179 = vfmadd231ss_fma(ZEXT416((uint)((float)local_8c0._0_4_ +
                                                         (float)local_ae0._0_4_)),local_680._0_16_,
                                           ZEXT416(0x36000000));
                auVar81 = vandps_avx(auVar118,local_a40);
                auVar202 = ZEXT3264(local_900);
                if (auVar81._0_4_ < auVar179._0_4_) {
                  fVar100 = fVar100 + (float)local_7c0._0_4_;
                  uVar68 = 0;
                  uVar273 = 0;
                  uVar275 = 0;
                  if (((((ray->org).field_0.m128[3] <= fVar100) && (fVar100 <= ray->tfar)) &&
                      (0.0 <= fVar70)) && (fVar70 <= 1.0)) {
                    auVar81 = vrsqrtss_avx(local_7e0._0_16_,local_7e0._0_16_);
                    fVar131 = auVar81._0_4_;
                    pGVar4 = (local_ae8->scene->geometries).items[local_a88].ptr;
                    if ((pGVar4->mask & ray->mask) != 0) {
                      if ((local_ae8->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        unaff_R13B = 1;
                      }
                      else {
                        local_ae0._0_4_ = ray->tfar;
                        fVar131 = fVar131 * 1.5 +
                                  local_7e0._0_4_ * -0.5 * fVar131 * fVar131 * fVar131;
                        auVar119._0_4_ = fVar131 * (float)local_840._0_4_;
                        auVar119._4_4_ = fVar131 * (float)local_840._4_4_;
                        auVar119._8_4_ = fVar131 * fStack_838;
                        auVar119._12_4_ = fVar131 * fStack_834;
                        auVar118 = vfmadd213ps_fma(auVar6,auVar119,local_9a0._0_16_);
                        auVar81 = vshufps_avx(auVar119,auVar119,0xc9);
                        auVar179 = vshufps_avx(local_9a0._0_16_,local_9a0._0_16_,0xc9);
                        auVar120._0_4_ = auVar119._0_4_ * auVar179._0_4_;
                        auVar120._4_4_ = auVar119._4_4_ * auVar179._4_4_;
                        auVar120._8_4_ = auVar119._8_4_ * auVar179._8_4_;
                        auVar120._12_4_ = auVar119._12_4_ * auVar179._12_4_;
                        auVar228 = vfmsub231ps_fma(auVar120,local_9a0._0_16_,auVar81);
                        auVar81 = vshufps_avx(auVar228,auVar228,0xc9);
                        auVar179 = vshufps_avx(auVar118,auVar118,0xc9);
                        auVar228 = vshufps_avx(auVar228,auVar228,0xd2);
                        auVar83._0_4_ = auVar118._0_4_ * auVar228._0_4_;
                        auVar83._4_4_ = auVar118._4_4_ * auVar228._4_4_;
                        auVar83._8_4_ = auVar118._8_4_ * auVar228._8_4_;
                        auVar83._12_4_ = auVar118._12_4_ * auVar228._12_4_;
                        auVar179 = vfmsub231ps_fma(auVar83,auVar81,auVar179);
                        auVar81 = vshufps_avx(auVar179,auVar179,0xe9);
                        local_930 = vmovlps_avx(auVar81);
                        local_928 = auVar179._0_4_;
                        local_920 = 0;
                        local_91c = local_a8c;
                        local_918 = (undefined4)local_a88;
                        local_914 = local_ae8->user->instID[0];
                        local_910 = local_ae8->user->instPrimID[0];
                        ray->tfar = fVar100;
                        local_aec = -1;
                        local_9f0.valid = &local_aec;
                        local_9f0.geometryUserPtr = pGVar4->userPtr;
                        local_9f0.context = local_ae8->user;
                        local_9f0.hit = (RTCHitN *)&local_930;
                        local_9f0.N = 1;
                        _local_ac0 = ZEXT416((uint)fVar70);
                        local_a80._0_16_ = ZEXT416((uint)fVar100);
                        local_9f0.ray = (RTCRayN *)ray;
                        local_924 = fVar70;
                        if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_016378ba:
                          p_Var5 = local_ae8->args->filter;
                          fVar70 = (float)local_ae0._0_4_;
                          if (p_Var5 != (RTCFilterFunctionN)0x0) {
                            if (((local_ae8->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                 ) != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                              auVar211 = ZEXT1664(auVar211._0_16_);
                              auVar230 = ZEXT1664(auVar230._0_16_);
                              (*p_Var5)(&local_9f0);
                              auVar261 = ZEXT1664(_local_ac0);
                              auVar254 = ZEXT3264(local_980);
                              auVar245 = ZEXT3264(local_960);
                              auVar202 = ZEXT3264(local_900);
                              fVar100 = (float)local_a80._0_4_;
                              uVar68 = local_a80._4_4_;
                              uVar273 = local_a80._8_4_;
                              uVar275 = local_a80._12_4_;
                            }
                            fVar70 = (float)local_ae0._0_4_;
                            if (*local_9f0.valid == 0) {
                              unaff_R13B = 0;
                              goto LAB_0163793b;
                            }
                          }
                          unaff_R13B = 1;
                        }
                        else {
                          auVar211 = ZEXT1664(auVar211._0_16_);
                          auVar230 = ZEXT1664(auVar230._0_16_);
                          (*pGVar4->occlusionFilterN)(&local_9f0);
                          auVar261 = ZEXT1664(_local_ac0);
                          auVar254 = ZEXT3264(local_980);
                          auVar245 = ZEXT3264(local_960);
                          auVar202 = ZEXT3264(local_900);
                          fVar100 = (float)local_a80._0_4_;
                          uVar68 = local_a80._4_4_;
                          uVar273 = local_a80._8_4_;
                          uVar275 = local_a80._12_4_;
                          if (*local_9f0.valid != 0) goto LAB_016378ba;
                          unaff_R13B = 0;
                          fVar70 = (float)local_ae0._0_4_;
                        }
LAB_0163793b:
                        if (unaff_R13B == 0) {
                          ray->tfar = fVar70;
                        }
                      }
                      bVar30 = false;
                      goto LAB_01637737;
                    }
                  }
                  bVar30 = false;
                  unaff_R13B = 0;
                }
              }
LAB_01637737:
              if (!bVar30) goto LAB_01637952;
              lVar66 = lVar66 + -1;
            } while (lVar66 != 0);
            unaff_R13B = 0;
LAB_01637952:
            unaff_R13B = unaff_R13B & 1;
            bVar63 = bVar63 | unaff_R13B;
            fVar100 = ray->tfar;
            auVar96._4_4_ = fVar100;
            auVar96._0_4_ = fVar100;
            auVar96._8_4_ = fVar100;
            auVar96._12_4_ = fVar100;
            auVar96._16_4_ = fVar100;
            auVar96._20_4_ = fVar100;
            auVar96._24_4_ = fVar100;
            auVar96._28_4_ = fVar100;
            auVar244 = vcmpps_avx(_local_6c0,auVar96,2);
            auVar94 = vandps_avx(auVar244,local_5a0);
            local_5a0 = local_5a0 & auVar244;
          } while ((((((((local_5a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (local_5a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_5a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(local_5a0 >> 0x7f,0) != '\0') ||
                     (local_5a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(local_5a0 >> 0xbf,0) != '\0') ||
                   (local_5a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   local_5a0[0x1f] < '\0');
        }
        auVar130._0_4_ = (float)local_860._0_4_ + local_3c0._0_4_;
        auVar130._4_4_ = (float)local_860._4_4_ + local_3c0._4_4_;
        auVar130._8_4_ = fStack_858 + local_3c0._8_4_;
        auVar130._12_4_ = fStack_854 + local_3c0._12_4_;
        auVar130._16_4_ = fStack_850 + local_3c0._16_4_;
        auVar130._20_4_ = fStack_84c + local_3c0._20_4_;
        auVar130._24_4_ = fStack_848 + local_3c0._24_4_;
        auVar130._28_4_ = fStack_844 + local_3c0._28_4_;
        fVar100 = ray->tfar;
        auVar175._4_4_ = fVar100;
        auVar175._0_4_ = fVar100;
        auVar175._8_4_ = fVar100;
        auVar175._12_4_ = fVar100;
        auVar175._16_4_ = fVar100;
        auVar175._20_4_ = fVar100;
        auVar175._24_4_ = fVar100;
        auVar175._28_4_ = fVar100;
        auVar244 = vcmpps_avx(auVar130,auVar175,2);
        auVar94 = vandps_avx(local_4e0,local_4c0);
        auVar94 = vandps_avx(auVar244,auVar94);
        auVar186._0_4_ = (float)local_860._0_4_ + local_400._0_4_;
        auVar186._4_4_ = (float)local_860._4_4_ + local_400._4_4_;
        auVar186._8_4_ = fStack_858 + local_400._8_4_;
        auVar186._12_4_ = fStack_854 + local_400._12_4_;
        auVar186._16_4_ = fStack_850 + local_400._16_4_;
        auVar186._20_4_ = fStack_84c + local_400._20_4_;
        auVar186._24_4_ = fStack_848 + local_400._24_4_;
        auVar186._28_4_ = fStack_844 + local_400._28_4_;
        auVar8 = vcmpps_avx(auVar186,auVar175,2);
        auVar244 = vandps_avx(local_780,_local_760);
        auVar244 = vandps_avx(auVar8,auVar244);
        auVar244 = vorps_avx(auVar94,auVar244);
        if ((((((((auVar244 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar244 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar244 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar244 >> 0x7f,0) != '\0') ||
              (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar244 >> 0xbf,0) != '\0') ||
            (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar244[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar62 * 0x60) = auVar244;
          auVar94 = vblendvps_avx(_local_400,local_3c0,auVar94);
          *(undefined1 (*) [32])(auStack_160 + uVar62 * 0x60) = auVar94;
          uVar71 = vmovlps_avx(local_7b0);
          *(undefined8 *)(afStack_140 + uVar62 * 0x18) = uVar71;
          auStack_138[uVar62 * 0x18] = (int)local_5c0 + 1;
          uVar62 = (ulong)((int)uVar62 + 1);
        }
      }
    }
    fVar100 = ray->tfar;
    auVar93._4_4_ = fVar100;
    auVar93._0_4_ = fVar100;
    auVar93._8_4_ = fVar100;
    auVar93._12_4_ = fVar100;
    auVar93._16_4_ = fVar100;
    auVar93._20_4_ = fVar100;
    auVar93._24_4_ = fVar100;
    auVar93._28_4_ = fVar100;
    fVar100 = (float)local_860._0_4_;
    fVar70 = (float)local_860._4_4_;
    fVar131 = fStack_858;
    fVar219 = fStack_854;
    fVar136 = fStack_850;
    fVar132 = fStack_84c;
    fVar220 = fStack_848;
    fVar133 = fStack_844;
    do {
      uVar64 = (uint)uVar62;
      if (uVar64 == 0) {
        if (bVar63 != 0) {
          return local_aed;
        }
        fVar100 = ray->tfar;
        auVar84._4_4_ = fVar100;
        auVar84._0_4_ = fVar100;
        auVar84._8_4_ = fVar100;
        auVar84._12_4_ = fVar100;
        auVar81 = vcmpps_avx(local_410,auVar84,2);
        uVar64 = vmovmskps_avx(auVar81);
        uVar64 = (uint)local_788 & uVar64;
        local_aed = uVar64 != 0;
        if (!local_aed) {
          return local_aed;
        }
        goto LAB_0163560e;
      }
      uVar62 = (ulong)(uVar64 - 1);
      lVar66 = uVar62 * 0x60;
      auVar94 = *(undefined1 (*) [32])(auStack_160 + lVar66);
      auVar121._0_4_ = fVar100 + auVar94._0_4_;
      auVar121._4_4_ = fVar70 + auVar94._4_4_;
      auVar121._8_4_ = fVar131 + auVar94._8_4_;
      auVar121._12_4_ = fVar219 + auVar94._12_4_;
      auVar121._16_4_ = fVar136 + auVar94._16_4_;
      auVar121._20_4_ = fVar132 + auVar94._20_4_;
      auVar121._24_4_ = fVar220 + auVar94._24_4_;
      auVar121._28_4_ = fVar133 + auVar94._28_4_;
      auVar8 = vcmpps_avx(auVar121,auVar93,2);
      auVar244 = vandps_avx(auVar8,*(undefined1 (*) [32])(auStack_180 + lVar66));
      local_3c0 = auVar244;
      auVar8 = *(undefined1 (*) [32])(auStack_180 + lVar66) & auVar8;
      bVar51 = (auVar8 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar52 = (auVar8 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar50 = (auVar8 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar49 = SUB321(auVar8 >> 0x7f,0) == '\0';
      bVar48 = (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar47 = SUB321(auVar8 >> 0xbf,0) == '\0';
      bVar45 = (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar30 = -1 < auVar8[0x1f];
      if (((((((!bVar51 || !bVar52) || !bVar50) || !bVar49) || !bVar48) || !bVar47) || !bVar45) ||
          !bVar30) {
        auVar172._8_4_ = 0x7f800000;
        auVar172._0_8_ = 0x7f8000007f800000;
        auVar172._12_4_ = 0x7f800000;
        auVar172._16_4_ = 0x7f800000;
        auVar172._20_4_ = 0x7f800000;
        auVar172._24_4_ = 0x7f800000;
        auVar172._28_4_ = 0x7f800000;
        auVar94 = vblendvps_avx(auVar172,auVar94,auVar244);
        auVar8 = vshufps_avx(auVar94,auVar94,0xb1);
        auVar8 = vminps_avx(auVar94,auVar8);
        auVar240 = vshufpd_avx(auVar8,auVar8,5);
        auVar8 = vminps_avx(auVar8,auVar240);
        auVar240 = vpermpd_avx2(auVar8,0x4e);
        auVar8 = vminps_avx(auVar8,auVar240);
        auVar94 = vcmpps_avx(auVar94,auVar8,0);
        auVar8 = auVar244 & auVar94;
        if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar8 >> 0x7f,0) != '\0') ||
              (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar8 >> 0xbf,0) != '\0') ||
            (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar8[0x1f] < '\0') {
          auVar244 = vandps_avx(auVar94,auVar244);
        }
        fVar100 = afStack_140[uVar62 * 0x18 + 1];
        local_5c0 = (ulong)auStack_138[uVar62 * 0x18];
        uVar67 = vmovmskps_avx(auVar244);
        iVar11 = 0;
        for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x80000000) {
          iVar11 = iVar11 + 1;
        }
        fVar70 = afStack_140[uVar62 * 0x18];
        auVar122._4_4_ = fVar70;
        auVar122._0_4_ = fVar70;
        auVar122._8_4_ = fVar70;
        auVar122._12_4_ = fVar70;
        auVar122._16_4_ = fVar70;
        auVar122._20_4_ = fVar70;
        auVar122._24_4_ = fVar70;
        auVar122._28_4_ = fVar70;
        *(undefined4 *)(local_3c0 + (uint)(iVar11 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar66) = local_3c0;
        uVar67 = uVar64 - 1;
        if ((((((((local_3c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_3c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_3c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_3c0 >> 0x7f,0) != '\0') ||
              (local_3c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_3c0 >> 0xbf,0) != '\0') ||
            (local_3c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_3c0[0x1f] < '\0') {
          uVar67 = uVar64;
        }
        fVar100 = fVar100 - fVar70;
        auVar143._4_4_ = fVar100;
        auVar143._0_4_ = fVar100;
        auVar143._8_4_ = fVar100;
        auVar143._12_4_ = fVar100;
        auVar143._16_4_ = fVar100;
        auVar143._20_4_ = fVar100;
        auVar143._24_4_ = fVar100;
        auVar143._28_4_ = fVar100;
        auVar81 = vfmadd132ps_fma(auVar143,auVar122,_DAT_02020f20);
        _local_400 = ZEXT1632(auVar81);
        local_7b0._8_8_ = 0;
        local_7b0._0_8_ = *(ulong *)(local_400 + (uint)(iVar11 << 2));
        uVar62 = (ulong)uVar67;
      }
      fVar100 = (float)local_860._0_4_;
      fVar70 = (float)local_860._4_4_;
      fVar131 = fStack_858;
      fVar219 = fStack_854;
      fVar136 = fStack_850;
      fVar132 = fStack_84c;
      fVar220 = fStack_848;
      fVar133 = fStack_844;
    } while (((((((bVar51 && bVar52) && bVar50) && bVar49) && bVar48) && bVar47) && bVar45) &&
             bVar30);
    auVar244 = auVar245._0_32_;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }